

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  byte bVar63;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar64;
  bool bVar65;
  byte bVar66;
  uint uVar67;
  bool bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar141;
  uint uVar142;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float pp;
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar164;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar157 [32];
  float fVar165;
  float fVar167;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar171;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar172 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar227 [32];
  undefined1 auVar221 [16];
  undefined1 auVar228 [32];
  undefined1 auVar226 [16];
  undefined1 auVar229 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar240;
  undefined1 auVar243 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [32];
  undefined1 auVar248 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar249 [64];
  float fVar250;
  float fVar256;
  undefined1 auVar252 [32];
  undefined1 auVar251 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar253 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [28];
  float fVar261;
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [32];
  float fVar267;
  float fVar268;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_b18;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  Primitive *local_650;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  fVar250 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar80 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar77 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  fVar216 = fVar250 * auVar77._0_4_;
  fVar148 = fVar250 * auVar80._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar60 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar60 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar14);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar60 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar74);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar75);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar95 = vpmovsxbd_avx2(auVar72);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar95);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar60 + 6);
  auVar87 = vpmovsxbd_avx2(auVar1);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar69 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar92 = vpmovsxbd_avx2(auVar76);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar69 + uVar60 + 6);
  auVar93 = vpmovsxbd_avx2(auVar73);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar64 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar64 + 6);
  auVar85 = vpmovsxbd_avx2(auVar232);
  auVar94 = vcvtdq2ps_avx(auVar85);
  auVar105._4_4_ = fVar148;
  auVar105._0_4_ = fVar148;
  auVar105._8_4_ = fVar148;
  auVar105._12_4_ = fVar148;
  auVar105._16_4_ = fVar148;
  auVar105._20_4_ = fVar148;
  auVar105._24_4_ = fVar148;
  auVar105._28_4_ = fVar148;
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  auVar83 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = ZEXT1632(CONCAT412(fVar250 * auVar80._12_4_,
                               CONCAT48(fVar250 * auVar80._8_4_,
                                        CONCAT44(fVar250 * auVar80._4_4_,fVar148))));
  auVar96 = vpermps_avx2(auVar107,auVar97);
  auVar84 = vpermps_avx512vl(auVar83,auVar97);
  fVar148 = auVar84._0_4_;
  fVar164 = auVar84._4_4_;
  auVar97._4_4_ = fVar164 * auVar89._4_4_;
  auVar97._0_4_ = fVar148 * auVar89._0_4_;
  fVar254 = auVar84._8_4_;
  auVar97._8_4_ = fVar254 * auVar89._8_4_;
  fVar255 = auVar84._12_4_;
  auVar97._12_4_ = fVar255 * auVar89._12_4_;
  fVar256 = auVar84._16_4_;
  auVar97._16_4_ = fVar256 * auVar89._16_4_;
  fVar230 = auVar84._20_4_;
  auVar97._20_4_ = fVar230 * auVar89._20_4_;
  fVar231 = auVar84._24_4_;
  auVar97._24_4_ = fVar231 * auVar89._24_4_;
  auVar97._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar87._4_4_ * fVar164;
  auVar95._0_4_ = auVar87._0_4_ * fVar148;
  auVar95._8_4_ = auVar87._8_4_ * fVar254;
  auVar95._12_4_ = auVar87._12_4_ * fVar255;
  auVar95._16_4_ = auVar87._16_4_ * fVar256;
  auVar95._20_4_ = auVar87._20_4_ * fVar230;
  auVar95._24_4_ = auVar87._24_4_ * fVar231;
  auVar95._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar94._4_4_ * fVar164;
  auVar85._0_4_ = auVar94._0_4_ * fVar148;
  auVar85._8_4_ = auVar94._8_4_ * fVar254;
  auVar85._12_4_ = auVar94._12_4_ * fVar255;
  auVar85._16_4_ = auVar94._16_4_ * fVar256;
  auVar85._20_4_ = auVar94._20_4_ * fVar230;
  auVar85._24_4_ = auVar94._24_4_ * fVar231;
  auVar85._28_4_ = auVar84._28_4_;
  auVar13 = vfmadd231ps_fma(auVar97,auVar96,auVar86);
  auVar14 = vfmadd231ps_fma(auVar95,auVar96,auVar91);
  auVar74 = vfmadd231ps_fma(auVar85,auVar93,auVar96);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar105,auVar88);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar105,auVar90);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar92,auVar105);
  auVar106._4_4_ = fVar216;
  auVar106._0_4_ = fVar216;
  auVar106._8_4_ = fVar216;
  auVar106._12_4_ = fVar216;
  auVar106._16_4_ = fVar216;
  auVar106._20_4_ = fVar216;
  auVar106._24_4_ = fVar216;
  auVar106._28_4_ = fVar216;
  auVar85 = ZEXT1632(CONCAT412(fVar250 * auVar77._12_4_,
                               CONCAT48(fVar250 * auVar77._8_4_,
                                        CONCAT44(fVar250 * auVar77._4_4_,fVar216))));
  auVar95 = vpermps_avx2(auVar107,auVar85);
  auVar85 = vpermps_avx512vl(auVar83,auVar85);
  fVar250 = auVar85._0_4_;
  fVar148 = auVar85._4_4_;
  auVar96._4_4_ = fVar148 * auVar89._4_4_;
  auVar96._0_4_ = fVar250 * auVar89._0_4_;
  fVar164 = auVar85._8_4_;
  auVar96._8_4_ = fVar164 * auVar89._8_4_;
  fVar254 = auVar85._12_4_;
  auVar96._12_4_ = fVar254 * auVar89._12_4_;
  fVar255 = auVar85._16_4_;
  auVar96._16_4_ = fVar255 * auVar89._16_4_;
  fVar256 = auVar85._20_4_;
  auVar96._20_4_ = fVar256 * auVar89._20_4_;
  fVar230 = auVar85._24_4_;
  auVar96._24_4_ = fVar230 * auVar89._24_4_;
  auVar96._28_4_ = 1;
  auVar83._4_4_ = auVar87._4_4_ * fVar148;
  auVar83._0_4_ = auVar87._0_4_ * fVar250;
  auVar83._8_4_ = auVar87._8_4_ * fVar164;
  auVar83._12_4_ = auVar87._12_4_ * fVar254;
  auVar83._16_4_ = auVar87._16_4_ * fVar255;
  auVar83._20_4_ = auVar87._20_4_ * fVar256;
  auVar83._24_4_ = auVar87._24_4_ * fVar230;
  auVar83._28_4_ = auVar89._28_4_;
  auVar87._4_4_ = auVar94._4_4_ * fVar148;
  auVar87._0_4_ = auVar94._0_4_ * fVar250;
  auVar87._8_4_ = auVar94._8_4_ * fVar164;
  auVar87._12_4_ = auVar94._12_4_ * fVar254;
  auVar87._16_4_ = auVar94._16_4_ * fVar255;
  auVar87._20_4_ = auVar94._20_4_ * fVar256;
  auVar87._24_4_ = auVar94._24_4_ * fVar230;
  auVar87._28_4_ = auVar85._28_4_;
  auVar75 = vfmadd231ps_fma(auVar96,auVar95,auVar86);
  auVar72 = vfmadd231ps_fma(auVar83,auVar95,auVar91);
  auVar1 = vfmadd231ps_fma(auVar87,auVar95,auVar93);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar106,auVar88);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar106,auVar90);
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar106,auVar92);
  auVar88 = vandps_avx(ZEXT1632(auVar13),auVar102);
  auVar104._8_4_ = 0x219392ef;
  auVar104._0_8_ = 0x219392ef219392ef;
  auVar104._12_4_ = 0x219392ef;
  auVar104._16_4_ = 0x219392ef;
  auVar104._20_4_ = 0x219392ef;
  auVar104._24_4_ = 0x219392ef;
  auVar104._28_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar88,auVar104,1);
  bVar65 = (bool)((byte)uVar69 & 1);
  auVar84._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar13._0_4_;
  bVar65 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar13._4_4_;
  bVar65 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar13._8_4_;
  bVar65 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar13._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar14),auVar102);
  uVar69 = vcmpps_avx512vl(auVar88,auVar104,1);
  bVar65 = (bool)((byte)uVar69 & 1);
  auVar98._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar14._0_4_;
  bVar65 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar14._4_4_;
  bVar65 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar14._8_4_;
  bVar65 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar14._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar74),auVar102);
  uVar69 = vcmpps_avx512vl(auVar88,auVar104,1);
  bVar65 = (bool)((byte)uVar69 & 1);
  auVar88._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar74._0_4_;
  bVar65 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar74._4_4_;
  bVar65 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar74._8_4_;
  bVar65 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar74._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar86 = vrcp14ps_avx512vl(auVar84);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar84,auVar86,auVar103);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar98);
  auVar14 = vfnmadd213ps_fma(auVar98,auVar86,auVar103);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar88);
  auVar74 = vfnmadd213ps_fma(auVar88,auVar86,auVar103);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar86,auVar86);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar75));
  auVar92._4_4_ = auVar13._4_4_ * auVar88._4_4_;
  auVar92._0_4_ = auVar13._0_4_ * auVar88._0_4_;
  auVar92._8_4_ = auVar13._8_4_ * auVar88._8_4_;
  auVar92._12_4_ = auVar13._12_4_ * auVar88._12_4_;
  auVar92._16_4_ = auVar88._16_4_ * 0.0;
  auVar92._20_4_ = auVar88._20_4_ * 0.0;
  auVar92._24_4_ = auVar88._24_4_ * 0.0;
  auVar92._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar75));
  auVar87 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar101._0_4_ = auVar13._0_4_ * auVar88._0_4_;
  auVar101._4_4_ = auVar13._4_4_ * auVar88._4_4_;
  auVar101._8_4_ = auVar13._8_4_ * auVar88._8_4_;
  auVar101._12_4_ = auVar13._12_4_ * auVar88._12_4_;
  auVar101._16_4_ = auVar88._16_4_ * 0.0;
  auVar101._20_4_ = auVar88._20_4_ * 0.0;
  auVar101._24_4_ = auVar88._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar60 * -2 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar72));
  auVar93._4_4_ = auVar14._4_4_ * auVar88._4_4_;
  auVar93._0_4_ = auVar14._0_4_ * auVar88._0_4_;
  auVar93._8_4_ = auVar14._8_4_ * auVar88._8_4_;
  auVar93._12_4_ = auVar14._12_4_ * auVar88._12_4_;
  auVar93._16_4_ = auVar88._16_4_ * 0.0;
  auVar93._20_4_ = auVar88._20_4_ * 0.0;
  auVar93._24_4_ = auVar88._24_4_ * 0.0;
  auVar93._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar86);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar72));
  auVar100._0_4_ = auVar14._0_4_ * auVar88._0_4_;
  auVar100._4_4_ = auVar14._4_4_ * auVar88._4_4_;
  auVar100._8_4_ = auVar14._8_4_ * auVar88._8_4_;
  auVar100._12_4_ = auVar14._12_4_ * auVar88._12_4_;
  auVar100._16_4_ = auVar88._16_4_ * 0.0;
  auVar100._20_4_ = auVar88._20_4_ * 0.0;
  auVar100._24_4_ = auVar88._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar64 + uVar60 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar1));
  auVar94._4_4_ = auVar88._4_4_ * auVar74._4_4_;
  auVar94._0_4_ = auVar88._0_4_ * auVar74._0_4_;
  auVar94._8_4_ = auVar88._8_4_ * auVar74._8_4_;
  auVar94._12_4_ = auVar88._12_4_ * auVar74._12_4_;
  auVar94._16_4_ = auVar88._16_4_ * 0.0;
  auVar94._20_4_ = auVar88._20_4_ * 0.0;
  auVar94._24_4_ = auVar88._24_4_ * 0.0;
  auVar94._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar1));
  auVar99._0_4_ = auVar74._0_4_ * auVar88._0_4_;
  auVar99._4_4_ = auVar74._4_4_ * auVar88._4_4_;
  auVar99._8_4_ = auVar74._8_4_ * auVar88._8_4_;
  auVar99._12_4_ = auVar74._12_4_ * auVar88._12_4_;
  auVar99._16_4_ = auVar88._16_4_ * 0.0;
  auVar99._20_4_ = auVar88._20_4_ * 0.0;
  auVar99._24_4_ = auVar88._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar92,auVar101);
  auVar86 = vpminsd_avx2(auVar93,auVar100);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86 = vpminsd_avx2(auVar94,auVar99);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar89._4_4_ = uVar171;
  auVar89._0_4_ = uVar171;
  auVar89._8_4_ = uVar171;
  auVar89._12_4_ = uVar171;
  auVar89._16_4_ = uVar171;
  auVar89._20_4_ = uVar171;
  auVar89._24_4_ = uVar171;
  auVar89._28_4_ = uVar171;
  auVar86 = vmaxps_avx512vl(auVar86,auVar89);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar88,auVar86);
  auVar88 = vpmaxsd_avx2(auVar92,auVar101);
  auVar86 = vpmaxsd_avx2(auVar93,auVar100);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar86 = vpmaxsd_avx2(auVar94,auVar99);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar90._4_4_ = uVar171;
  auVar90._0_4_ = uVar171;
  auVar90._8_4_ = uVar171;
  auVar90._12_4_ = uVar171;
  auVar90._16_4_ = uVar171;
  auVar90._20_4_ = uVar171;
  auVar90._24_4_ = uVar171;
  auVar90._28_4_ = uVar171;
  auVar86 = vminps_avx512vl(auVar86,auVar90);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar91);
  uVar17 = vpcmpgtd_avx512vl(auVar87,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_2e0,auVar88,2);
  if ((byte)((byte)uVar16 & (byte)uVar17) == 0) {
    return false;
  }
  local_648 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_650 = prim;
LAB_01d73406:
  lVar61 = 0;
  for (uVar69 = local_648; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar67].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar61 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar61 = *(long *)&pGVar3[1].time_range.upper;
  auVar13 = *(undefined1 (*) [16])(lVar61 + (long)p_Var4 * uVar69);
  auVar14 = *(undefined1 (*) [16])(lVar61 + (uVar69 + 1) * (long)p_Var4);
  auVar74 = *(undefined1 (*) [16])(lVar61 + (uVar69 + 2) * (long)p_Var4);
  local_648 = local_648 - 1 & local_648;
  auVar75 = *(undefined1 (*) [16])(lVar61 + (uVar69 + 3) * (long)p_Var4);
  if (local_648 != 0) {
    uVar64 = local_648 - 1 & local_648;
    for (uVar69 = local_648; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    }
    if (uVar64 != 0) {
      for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar81._4_4_ = uVar171;
  auVar81._0_4_ = uVar171;
  auVar81._8_4_ = uVar171;
  auVar81._12_4_ = uVar171;
  fStack_570 = (float)uVar171;
  _local_580 = auVar81;
  fStack_56c = (float)uVar171;
  fStack_568 = (float)uVar171;
  register0x0000151c = uVar171;
  auVar265 = ZEXT3264(_local_580);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar82._4_4_ = uVar171;
  auVar82._0_4_ = uVar171;
  auVar82._8_4_ = uVar171;
  auVar82._12_4_ = uVar171;
  local_5a0._16_4_ = uVar171;
  local_5a0._0_16_ = auVar82;
  local_5a0._20_4_ = uVar171;
  local_5a0._24_4_ = uVar171;
  local_5a0._28_4_ = uVar171;
  auVar72 = vunpcklps_avx(auVar81,auVar82);
  fVar250 = *(float *)(ray + k * 4 + 0xc0);
  auVar257._4_4_ = fVar250;
  auVar257._0_4_ = fVar250;
  auVar257._8_4_ = fVar250;
  auVar257._12_4_ = fVar250;
  local_5c0._16_4_ = fVar250;
  local_5c0._0_16_ = auVar257;
  local_5c0._20_4_ = fVar250;
  local_5c0._24_4_ = fVar250;
  local_5c0._28_4_ = fVar250;
  local_790 = vinsertps_avx(auVar72,auVar257,0x28);
  auVar258 = ZEXT1664(local_790);
  auVar77._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar74._0_4_ + auVar75._0_4_;
  auVar77._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar74._4_4_ + auVar75._4_4_;
  auVar77._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar74._8_4_ + auVar75._8_4_;
  auVar77._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar74._12_4_ + auVar75._12_4_;
  auVar80._8_4_ = 0x3e800000;
  auVar80._0_8_ = 0x3e8000003e800000;
  auVar80._12_4_ = 0x3e800000;
  auVar72 = vmulps_avx512vl(auVar77,auVar80);
  auVar72 = vsubps_avx(auVar72,auVar1);
  auVar72 = vdpps_avx(auVar72,local_790,0x7f);
  fVar148 = *(float *)(ray + k * 4 + 0x60);
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  auVar262 = ZEXT1664(local_7a0);
  auVar78._4_12_ = ZEXT812(0) << 0x20;
  auVar78._0_4_ = local_7a0._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar78);
  auVar76 = vfnmadd213ss_fma(auVar73,local_7a0,ZEXT416(0x40000000));
  fVar164 = auVar72._0_4_ * auVar73._0_4_ * auVar76._0_4_;
  auVar79._4_4_ = fVar164;
  auVar79._0_4_ = fVar164;
  auVar79._8_4_ = fVar164;
  auVar79._12_4_ = fVar164;
  auVar72 = vfmadd231ps_fma(auVar1,local_790,auVar79);
  auVar72 = vblendps_avx(auVar72,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar72);
  auVar74 = vsubps_avx(auVar74,auVar72);
  auVar249 = ZEXT1664(auVar74);
  auVar14 = vsubps_avx(auVar14,auVar72);
  auVar253 = ZEXT1664(auVar14);
  auVar75 = vsubps_avx(auVar75,auVar72);
  auVar88 = vbroadcastss_avx512vl(auVar13);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_720 = ZEXT1632(auVar13);
  auVar86 = vpermps_avx512vl(auVar109,local_720);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  auVar89 = vpermps_avx512vl(auVar110,local_720);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar111,local_720);
  auVar91 = vbroadcastss_avx512vl(auVar14);
  local_760 = ZEXT1632(auVar14);
  auVar87 = vpermps_avx512vl(auVar109,local_760);
  auVar92 = vpermps_avx512vl(auVar110,local_760);
  auVar93 = vpermps_avx512vl(auVar111,local_760);
  auVar94 = vbroadcastss_avx512vl(auVar74);
  local_740 = ZEXT1632(auVar74);
  auVar95 = vpermps_avx512vl(auVar109,local_740);
  auVar85 = vpermps_avx512vl(auVar110,local_740);
  auVar96 = vpermps_avx512vl(auVar111,local_740);
  auVar97 = vbroadcastss_avx512vl(auVar75);
  _local_780 = ZEXT1632(auVar75);
  local_260 = vpermps_avx512vl(auVar109,_local_780);
  local_280 = vpermps_avx2(auVar110,_local_780);
  local_240 = vpermps_avx512vl(auVar111,_local_780);
  auVar13 = vfmadd231ps_fma(ZEXT432((uint)(fVar250 * fVar250)),local_5a0,local_5a0);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),_local_580,_local_580);
  local_220._0_4_ = auVar13._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar108);
  local_6b0 = ZEXT416((uint)fVar164);
  local_2c0 = fVar148 - fVar164;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_4a0 = vpbroadcastd_avx512vl();
  local_b18 = 1;
  uVar62 = 0;
  bVar65 = false;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar13 = vsqrtss_avx(local_7a0,local_7a0);
  auVar14 = vsqrtss_avx(local_7a0,local_7a0);
  local_510 = ZEXT816(0x3f80000000000000);
  auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_2a0 = local_240;
  do {
    auVar74 = vmovshdup_avx(local_510);
    auVar74 = vsubps_avx(auVar74,local_510);
    auVar157._0_4_ = auVar74._0_4_;
    fVar15 = auVar157._0_4_ * 0.04761905;
    uVar171 = local_510._0_4_;
    auVar235._4_4_ = uVar171;
    auVar235._0_4_ = uVar171;
    auVar235._8_4_ = uVar171;
    auVar235._12_4_ = uVar171;
    auVar235._16_4_ = uVar171;
    auVar235._20_4_ = uVar171;
    auVar235._24_4_ = uVar171;
    auVar235._28_4_ = uVar171;
    auVar157._4_4_ = auVar157._0_4_;
    auVar157._8_4_ = auVar157._0_4_;
    auVar157._12_4_ = auVar157._0_4_;
    auVar157._16_4_ = auVar157._0_4_;
    auVar157._20_4_ = auVar157._0_4_;
    auVar157._24_4_ = auVar157._0_4_;
    auVar157._28_4_ = auVar157._0_4_;
    auVar74 = vfmadd231ps_fma(auVar235,auVar157,_DAT_01faff20);
    auVar83 = vsubps_avx(auVar244._0_32_,ZEXT1632(auVar74));
    fVar250 = auVar83._0_4_;
    fVar255 = auVar83._4_4_;
    fVar230 = auVar83._8_4_;
    fVar216 = auVar83._12_4_;
    fVar240 = auVar83._16_4_;
    fVar268 = auVar83._20_4_;
    fVar188 = auVar83._24_4_;
    fVar149 = fVar250 * fVar250 * fVar250;
    fVar165 = fVar255 * fVar255 * fVar255;
    auVar112._4_4_ = fVar165;
    auVar112._0_4_ = fVar149;
    fVar166 = fVar230 * fVar230 * fVar230;
    auVar112._8_4_ = fVar166;
    fVar167 = fVar216 * fVar216 * fVar216;
    auVar112._12_4_ = fVar167;
    fVar168 = fVar240 * fVar240 * fVar240;
    auVar112._16_4_ = fVar168;
    fVar169 = fVar268 * fVar268 * fVar268;
    auVar112._20_4_ = fVar169;
    fVar170 = fVar188 * fVar188 * fVar188;
    auVar112._24_4_ = fVar170;
    auVar112._28_4_ = auVar157._0_4_;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar98 = vmulps_avx512vl(auVar112,auVar84);
    fVar254 = auVar74._0_4_;
    fVar256 = auVar74._4_4_;
    fVar231 = auVar74._8_4_;
    fVar267 = auVar74._12_4_;
    fVar187 = fVar254 * fVar254 * fVar254;
    fVar213 = fVar256 * fVar256 * fVar256;
    fVar214 = fVar231 * fVar231 * fVar231;
    fVar215 = fVar267 * fVar267 * fVar267;
    auVar55._28_4_ = DAT_01faff20._28_4_;
    auVar55._0_28_ = ZEXT1628(CONCAT412(fVar215,CONCAT48(fVar214,CONCAT44(fVar213,fVar187))));
    auVar259._0_4_ = fVar254 * fVar250;
    auVar259._4_4_ = fVar256 * fVar255;
    auVar259._8_4_ = fVar231 * fVar230;
    auVar259._12_4_ = fVar267 * fVar216;
    auVar259._16_4_ = fVar240 * 0.0;
    auVar259._20_4_ = fVar268 * 0.0;
    auVar259._28_36_ = auVar258._28_36_;
    auVar259._24_4_ = fVar188 * 0.0;
    auVar99 = vmulps_avx512vl(auVar55,auVar84);
    fVar261 = auVar99._28_4_ + auVar157._0_4_;
    auVar118._4_4_ = fVar165 * 0.16666667;
    auVar118._0_4_ = fVar149 * 0.16666667;
    auVar118._8_4_ = fVar166 * 0.16666667;
    auVar118._12_4_ = fVar167 * 0.16666667;
    auVar118._16_4_ = fVar168 * 0.16666667;
    auVar118._20_4_ = fVar169 * 0.16666667;
    auVar118._24_4_ = fVar170 * 0.16666667;
    auVar118._28_4_ = fVar261;
    auVar119._4_4_ =
         (auVar259._4_4_ * fVar255 * 12.0 + auVar259._4_4_ * fVar256 * 6.0 + fVar213 + auVar98._4_4_
         ) * 0.16666667;
    auVar119._0_4_ =
         (auVar259._0_4_ * fVar250 * 12.0 + auVar259._0_4_ * fVar254 * 6.0 + fVar187 + auVar98._0_4_
         ) * 0.16666667;
    auVar119._8_4_ =
         (auVar259._8_4_ * fVar230 * 12.0 + auVar259._8_4_ * fVar231 * 6.0 + fVar214 + auVar98._8_4_
         ) * 0.16666667;
    auVar119._12_4_ =
         (auVar259._12_4_ * fVar216 * 12.0 + auVar259._12_4_ * fVar267 * 6.0 +
         fVar215 + auVar98._12_4_) * 0.16666667;
    auVar119._16_4_ =
         (auVar259._16_4_ * fVar240 * 12.0 + auVar259._16_4_ * 0.0 * 6.0 + auVar98._16_4_ + 0.0) *
         0.16666667;
    auVar119._20_4_ =
         (auVar259._20_4_ * fVar268 * 12.0 + auVar259._20_4_ * 0.0 * 6.0 + auVar98._20_4_ + 0.0) *
         0.16666667;
    auVar119._24_4_ =
         (auVar259._24_4_ * fVar188 * 12.0 + auVar259._24_4_ * 0.0 * 6.0 + auVar98._24_4_ + 0.0) *
         0.16666667;
    auVar119._28_4_ = auVar262._28_4_;
    auVar120._4_4_ =
         (auVar99._4_4_ + fVar165 + auVar259._4_4_ * fVar256 * 12.0 + auVar259._4_4_ * fVar255 * 6.0
         ) * 0.16666667;
    auVar120._0_4_ =
         (auVar99._0_4_ + fVar149 + auVar259._0_4_ * fVar254 * 12.0 + auVar259._0_4_ * fVar250 * 6.0
         ) * 0.16666667;
    auVar120._8_4_ =
         (auVar99._8_4_ + fVar166 + auVar259._8_4_ * fVar231 * 12.0 + auVar259._8_4_ * fVar230 * 6.0
         ) * 0.16666667;
    auVar120._12_4_ =
         (auVar99._12_4_ + fVar167 +
         auVar259._12_4_ * fVar267 * 12.0 + auVar259._12_4_ * fVar216 * 6.0) * 0.16666667;
    auVar120._16_4_ =
         (auVar99._16_4_ + fVar168 + auVar259._16_4_ * 0.0 * 12.0 + auVar259._16_4_ * fVar240 * 6.0)
         * 0.16666667;
    auVar120._20_4_ =
         (auVar99._20_4_ + fVar169 + auVar259._20_4_ * 0.0 * 12.0 + auVar259._20_4_ * fVar268 * 6.0)
         * 0.16666667;
    auVar120._24_4_ =
         (auVar99._24_4_ + fVar170 + auVar259._24_4_ * 0.0 * 12.0 + auVar259._24_4_ * fVar188 * 6.0)
         * 0.16666667;
    auVar120._28_4_ = auVar265._28_4_;
    auVar121._28_4_ = fVar261 + auVar262._28_4_ + auVar244._28_4_;
    auVar121._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * 0.16666667,
                            CONCAT48(fVar214 * 0.16666667,
                                     CONCAT44(fVar213 * 0.16666667,fVar187 * 0.16666667))));
    auVar98 = vmulps_avx512vl(auVar97,auVar121);
    auVar99 = vmulps_avx512vl(local_260,auVar121);
    auVar122._4_4_ = local_280._4_4_ * fVar213 * 0.16666667;
    auVar122._0_4_ = local_280._0_4_ * fVar187 * 0.16666667;
    auVar122._8_4_ = local_280._8_4_ * fVar214 * 0.16666667;
    auVar122._12_4_ = local_280._12_4_ * fVar215 * 0.16666667;
    auVar122._16_4_ = local_280._16_4_ * 0.0;
    auVar122._20_4_ = local_280._20_4_ * 0.0;
    auVar122._24_4_ = local_280._24_4_ * 0.0;
    auVar122._28_4_ = auVar157._0_4_;
    auVar100 = vmulps_avx512vl(local_2a0,auVar121);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar120,auVar94);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar120,auVar95);
    auVar101 = vfmadd231ps_avx512vl(auVar122,auVar120,auVar85);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar120);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar119,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar119,auVar87);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar119,auVar92);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar93,auVar119);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar118,auVar88);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar118,auVar86);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar118,auVar89);
    auVar98 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar118);
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar99 = vxorps_avx512vl(auVar83,auVar105);
    auVar100 = vxorps_avx512vl(ZEXT1632(auVar74),auVar105);
    auVar236._0_4_ = auVar100._0_4_ * fVar254;
    auVar236._4_4_ = auVar100._4_4_ * fVar256;
    auVar236._8_4_ = auVar100._8_4_ * fVar231;
    auVar236._12_4_ = auVar100._12_4_ * fVar267;
    auVar236._16_4_ = auVar100._16_4_ * 0.0;
    auVar236._20_4_ = auVar100._20_4_ * 0.0;
    auVar236._24_4_ = auVar100._24_4_ * 0.0;
    auVar236._28_4_ = 0;
    auVar100 = vmulps_avx512vl(auVar259._0_32_,auVar84);
    auVar84 = vsubps_avx(auVar236,auVar100);
    auVar123._4_4_ = auVar99._4_4_ * fVar255 * 0.5;
    auVar123._0_4_ = auVar99._0_4_ * fVar250 * 0.5;
    auVar123._8_4_ = auVar99._8_4_ * fVar230 * 0.5;
    auVar123._12_4_ = auVar99._12_4_ * fVar216 * 0.5;
    auVar123._16_4_ = auVar99._16_4_ * fVar240 * 0.5;
    auVar123._20_4_ = auVar99._20_4_ * fVar268 * 0.5;
    auVar123._24_4_ = auVar99._24_4_ * fVar188 * 0.5;
    auVar123._28_4_ = auVar83._28_4_;
    auVar124._4_4_ = auVar84._4_4_ * 0.5;
    auVar124._0_4_ = auVar84._0_4_ * 0.5;
    auVar124._8_4_ = auVar84._8_4_ * 0.5;
    auVar124._12_4_ = auVar84._12_4_ * 0.5;
    auVar124._16_4_ = auVar84._16_4_ * 0.5;
    auVar124._20_4_ = auVar84._20_4_ * 0.5;
    auVar124._24_4_ = auVar84._24_4_ * 0.5;
    auVar124._28_4_ = auVar84._28_4_;
    auVar127._4_4_ = (auVar100._4_4_ + fVar255 * fVar255) * 0.5;
    auVar127._0_4_ = (auVar100._0_4_ + fVar250 * fVar250) * 0.5;
    auVar127._8_4_ = (auVar100._8_4_ + fVar230 * fVar230) * 0.5;
    auVar127._12_4_ = (auVar100._12_4_ + fVar216 * fVar216) * 0.5;
    auVar127._16_4_ = (auVar100._16_4_ + fVar240 * fVar240) * 0.5;
    auVar127._20_4_ = (auVar100._20_4_ + fVar268 * fVar268) * 0.5;
    auVar127._24_4_ = (auVar100._24_4_ + fVar188 * fVar188) * 0.5;
    auVar127._28_4_ = auVar100._28_4_ + auVar249._28_4_;
    fVar250 = fVar254 * fVar254 * 0.5;
    fVar254 = fVar256 * fVar256 * 0.5;
    fVar255 = fVar231 * fVar231 * 0.5;
    fVar256 = fVar267 * fVar267 * 0.5;
    auVar128._28_4_ = auVar253._28_4_;
    auVar128._0_28_ = ZEXT1628(CONCAT412(fVar256,CONCAT48(fVar255,CONCAT44(fVar254,fVar250))));
    auVar227._4_4_ = auVar97._4_4_ * fVar254;
    auVar227._0_4_ = auVar97._0_4_ * fVar250;
    auVar227._8_4_ = auVar97._8_4_ * fVar255;
    auVar227._12_4_ = auVar97._12_4_ * fVar256;
    auVar227._16_4_ = auVar97._16_4_ * 0.0;
    auVar227._20_4_ = auVar97._20_4_ * 0.0;
    auVar227._24_4_ = auVar97._24_4_ * 0.0;
    auVar227._28_4_ = 0x3f000000;
    auVar83 = vmulps_avx512vl(local_260,auVar128);
    auVar32._4_4_ = local_280._4_4_ * fVar254;
    auVar32._0_4_ = local_280._0_4_ * fVar250;
    auVar32._8_4_ = local_280._8_4_ * fVar255;
    auVar32._12_4_ = local_280._12_4_ * fVar256;
    auVar32._16_4_ = local_280._16_4_ * 0.0;
    auVar32._20_4_ = local_280._20_4_ * 0.0;
    auVar32._24_4_ = local_280._24_4_ * 0.0;
    auVar32._28_4_ = auVar97._28_4_;
    auVar84 = vmulps_avx512vl(local_2a0,auVar128);
    auVar99 = vfmadd231ps_avx512vl(auVar227,auVar127,auVar94);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar127,auVar95);
    auVar100 = vfmadd231ps_avx512vl(auVar32,auVar127,auVar85);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar96,auVar127);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar124,auVar91);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar124,auVar87);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar124,auVar92);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar93,auVar124);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar123,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar123,auVar86);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar123,auVar89);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar123);
    auVar33._4_4_ = auVar99._4_4_ * fVar15;
    auVar33._0_4_ = auVar99._0_4_ * fVar15;
    auVar33._8_4_ = auVar99._8_4_ * fVar15;
    auVar33._12_4_ = auVar99._12_4_ * fVar15;
    auVar33._16_4_ = auVar99._16_4_ * fVar15;
    auVar33._20_4_ = auVar99._20_4_ * fVar15;
    auVar33._24_4_ = auVar99._24_4_ * fVar15;
    auVar33._28_4_ = auVar265._28_4_;
    auVar265 = ZEXT3264(auVar33);
    auVar34._4_4_ = auVar83._4_4_ * fVar15;
    auVar34._0_4_ = auVar83._0_4_ * fVar15;
    auVar34._8_4_ = auVar83._8_4_ * fVar15;
    auVar34._12_4_ = auVar83._12_4_ * fVar15;
    auVar34._16_4_ = auVar83._16_4_ * fVar15;
    auVar34._20_4_ = auVar83._20_4_ * fVar15;
    auVar34._24_4_ = auVar83._24_4_ * fVar15;
    auVar34._28_4_ = 0x3e2aaaab;
    auVar35._4_4_ = auVar100._4_4_ * fVar15;
    auVar35._0_4_ = auVar100._0_4_ * fVar15;
    auVar35._8_4_ = auVar100._8_4_ * fVar15;
    auVar35._12_4_ = auVar100._12_4_ * fVar15;
    auVar35._16_4_ = auVar100._16_4_ * fVar15;
    auVar35._20_4_ = auVar100._20_4_ * fVar15;
    auVar35._24_4_ = auVar100._24_4_ * fVar15;
    auVar35._28_4_ = 0x40c00000;
    fVar250 = auVar84._0_4_ * fVar15;
    fVar254 = auVar84._4_4_ * fVar15;
    auVar36._4_4_ = fVar254;
    auVar36._0_4_ = fVar250;
    fVar255 = auVar84._8_4_ * fVar15;
    auVar36._8_4_ = fVar255;
    fVar256 = auVar84._12_4_ * fVar15;
    auVar36._12_4_ = fVar256;
    fVar230 = auVar84._16_4_ * fVar15;
    auVar36._16_4_ = fVar230;
    fVar231 = auVar84._20_4_ * fVar15;
    auVar36._20_4_ = fVar231;
    fVar216 = auVar84._24_4_ * fVar15;
    auVar36._24_4_ = fVar216;
    auVar36._28_4_ = fVar15;
    auVar74 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar106 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,ZEXT1632(auVar74));
    auVar258 = ZEXT3264(auVar106);
    auVar107 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,ZEXT1632(auVar74));
    auVar99 = ZEXT1632(auVar74);
    auVar108 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,auVar99);
    auVar262 = ZEXT3264(auVar108);
    auVar237._0_4_ = fVar250 + auVar98._0_4_;
    auVar237._4_4_ = fVar254 + auVar98._4_4_;
    auVar237._8_4_ = fVar255 + auVar98._8_4_;
    auVar237._12_4_ = fVar256 + auVar98._12_4_;
    auVar237._16_4_ = fVar230 + auVar98._16_4_;
    auVar237._20_4_ = fVar231 + auVar98._20_4_;
    auVar237._24_4_ = fVar216 + auVar98._24_4_;
    auVar237._28_4_ = fVar15 + auVar98._28_4_;
    auVar83 = vmaxps_avx(auVar98,auVar237);
    auVar84 = vminps_avx(auVar98,auVar237);
    auVar109 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,auVar99);
    auVar110 = vpermt2ps_avx512vl(auVar33,_DAT_01feed00,auVar99);
    auVar253 = ZEXT3264(auVar110);
    auVar111 = vpermt2ps_avx512vl(auVar34,_DAT_01feed00,auVar99);
    auVar123 = ZEXT1632(auVar74);
    auVar112 = vpermt2ps_avx512vl(auVar35,_DAT_01feed00,auVar123);
    auVar98 = vpermt2ps_avx512vl(auVar36,_DAT_01feed00,auVar123);
    auVar113 = vsubps_avx512vl(auVar109,auVar98);
    auVar98 = vsubps_avx(auVar106,auVar102);
    auVar249 = ZEXT3264(auVar98);
    auVar99 = vsubps_avx(auVar107,auVar103);
    auVar100 = vsubps_avx(auVar108,auVar104);
    auVar101 = vmulps_avx512vl(auVar99,auVar35);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar34,auVar100);
    auVar114 = vmulps_avx512vl(auVar100,auVar33);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar35,auVar98);
    auVar115 = vmulps_avx512vl(auVar98,auVar34);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar33,auVar99);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar101,auVar101);
    auVar101 = vmulps_avx512vl(auVar100,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
    auVar116 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
    auVar115 = vrcp14ps_avx512vl(auVar116);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vfnmadd213ps_avx512vl(auVar115,auVar116,auVar101);
    auVar115 = vfmadd132ps_avx512vl(auVar117,auVar115,auVar115);
    auVar114 = vmulps_avx512vl(auVar114,auVar115);
    auVar117 = vmulps_avx512vl(auVar99,auVar112);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar100);
    auVar118 = vmulps_avx512vl(auVar100,auVar110);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar112,auVar98);
    auVar119 = vmulps_avx512vl(auVar98,auVar111);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar110,auVar99);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar117,auVar115);
    auVar114 = vmaxps_avx512vl(auVar114,auVar115);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar115 = vmaxps_avx512vl(auVar113,auVar109);
    auVar83 = vmaxps_avx512vl(auVar83,auVar115);
    auVar117 = vaddps_avx512vl(auVar114,auVar83);
    auVar83 = vminps_avx512vl(auVar113,auVar109);
    auVar83 = vminps_avx(auVar84,auVar83);
    auVar83 = vsubps_avx512vl(auVar83,auVar114);
    auVar113._8_4_ = 0x3f800002;
    auVar113._0_8_ = 0x3f8000023f800002;
    auVar113._12_4_ = 0x3f800002;
    auVar113._16_4_ = 0x3f800002;
    auVar113._20_4_ = 0x3f800002;
    auVar113._24_4_ = 0x3f800002;
    auVar113._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar117,auVar113);
    auVar114._8_4_ = 0x3f7ffffc;
    auVar114._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar114._12_4_ = 0x3f7ffffc;
    auVar114._16_4_ = 0x3f7ffffc;
    auVar114._20_4_ = 0x3f7ffffc;
    auVar114._24_4_ = 0x3f7ffffc;
    auVar114._28_4_ = 0x3f7ffffc;
    auVar83 = vmulps_avx512vl(auVar83,auVar114);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar109 = vrsqrt14ps_avx512vl(auVar116);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar113 = vmulps_avx512vl(auVar116,auVar115);
    fVar250 = auVar109._0_4_;
    fVar254 = auVar109._4_4_;
    fVar255 = auVar109._8_4_;
    fVar256 = auVar109._12_4_;
    fVar230 = auVar109._16_4_;
    fVar231 = auVar109._20_4_;
    fVar216 = auVar109._24_4_;
    auVar37._4_4_ = fVar254 * fVar254 * fVar254 * auVar113._4_4_;
    auVar37._0_4_ = fVar250 * fVar250 * fVar250 * auVar113._0_4_;
    auVar37._8_4_ = fVar255 * fVar255 * fVar255 * auVar113._8_4_;
    auVar37._12_4_ = fVar256 * fVar256 * fVar256 * auVar113._12_4_;
    auVar37._16_4_ = fVar230 * fVar230 * fVar230 * auVar113._16_4_;
    auVar37._20_4_ = fVar231 * fVar231 * fVar231 * auVar113._20_4_;
    auVar37._24_4_ = fVar216 * fVar216 * fVar216 * auVar113._24_4_;
    auVar37._28_4_ = auVar117._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_avx512vl(auVar37,auVar109,auVar116);
    auVar113 = vmulps_avx512vl(auVar98,auVar109);
    auVar114 = vmulps_avx512vl(auVar99,auVar109);
    auVar115 = vmulps_avx512vl(auVar100,auVar109);
    auVar116 = vsubps_avx512vl(auVar123,auVar102);
    auVar118 = vsubps_avx512vl(auVar123,auVar103);
    auVar119 = vsubps_avx512vl(auVar123,auVar104);
    auVar117 = vmulps_avx512vl(local_5c0,auVar119);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_5a0,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar117,_local_580,auVar116);
    auVar120 = vmulps_avx512vl(auVar119,auVar119);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar116);
    auVar121 = vmulps_avx512vl(local_5c0,auVar115);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar114,local_5a0);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,_local_580);
    auVar115 = vmulps_avx512vl(auVar119,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar118,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar113);
    auVar114 = vmulps_avx512vl(auVar121,auVar121);
    auVar115 = vsubps_avx512vl(local_220,auVar114);
    auVar122 = vmulps_avx512vl(auVar121,auVar113);
    auVar117 = vsubps_avx512vl(auVar117,auVar122);
    auVar122 = vaddps_avx512vl(auVar117,auVar117);
    auVar117 = vmulps_avx512vl(auVar113,auVar113);
    local_7c0 = vsubps_avx512vl(auVar120,auVar117);
    auVar84 = vsubps_avx512vl(local_7c0,auVar84);
    local_700 = vmulps_avx512vl(auVar122,auVar122);
    auVar117._8_4_ = 0x40800000;
    auVar117._0_8_ = 0x4080000040800000;
    auVar117._12_4_ = 0x40800000;
    auVar117._16_4_ = 0x40800000;
    auVar117._20_4_ = 0x40800000;
    auVar117._24_4_ = 0x40800000;
    auVar117._28_4_ = 0x40800000;
    auVar117 = vmulps_avx512vl(auVar115,auVar117);
    auVar120 = vmulps_avx512vl(auVar117,auVar84);
    auVar120 = vsubps_avx512vl(local_700,auVar120);
    uVar69 = vcmpps_avx512vl(auVar120,auVar123,5);
    bVar56 = (byte)uVar69;
    if (bVar56 == 0) {
LAB_01d741b1:
      auVar244 = ZEXT3264(auVar101);
    }
    else {
      auVar120 = vsqrtps_avx512vl(auVar120);
      auVar123 = vaddps_avx512vl(auVar115,auVar115);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar101 = vfnmadd213ps_avx512vl(auVar124,auVar123,auVar101);
      auVar101 = vfmadd132ps_avx512vl(auVar101,auVar124,auVar124);
      _local_600 = vxorps_avx512vl(auVar122,auVar105);
      auVar105 = vsubps_avx512vl(_local_600,auVar120);
      auVar105 = vmulps_avx512vl(auVar105,auVar101);
      auVar120 = vsubps_avx512vl(auVar120,auVar122);
      local_5e0 = vmulps_avx512vl(auVar120,auVar101);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vblendmps_avx512vl(auVar101,auVar105);
      auVar125._0_4_ =
           (uint)(bVar56 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar101._0_4_;
      bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar68 * auVar120._4_4_ | (uint)!bVar68 * auVar101._4_4_;
      bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar68 * auVar120._8_4_ | (uint)!bVar68 * auVar101._8_4_;
      bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar68 * auVar120._12_4_ | (uint)!bVar68 * auVar101._12_4_;
      bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar68 * auVar120._16_4_ | (uint)!bVar68 * auVar101._16_4_;
      bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar68 * auVar120._20_4_ | (uint)!bVar68 * auVar101._20_4_;
      bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar68 * auVar120._24_4_ | (uint)!bVar68 * auVar101._24_4_;
      bVar68 = SUB81(uVar69 >> 7,0);
      auVar125._28_4_ = (uint)bVar68 * auVar120._28_4_ | (uint)!bVar68 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar101,local_5e0);
      auVar126._0_4_ =
           (uint)(bVar56 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar101._0_4_;
      bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar68 * auVar120._4_4_ | (uint)!bVar68 * auVar101._4_4_;
      bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar68 * auVar120._8_4_ | (uint)!bVar68 * auVar101._8_4_;
      bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar68 * auVar120._12_4_ | (uint)!bVar68 * auVar101._12_4_;
      bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar68 * auVar120._16_4_ | (uint)!bVar68 * auVar101._16_4_;
      bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar68 * auVar120._20_4_ | (uint)!bVar68 * auVar101._20_4_;
      bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar68 * auVar120._24_4_ | (uint)!bVar68 * auVar101._24_4_;
      bVar68 = SUB81(uVar69 >> 7,0);
      auVar126._28_4_ = (uint)bVar68 * auVar120._28_4_ | (uint)!bVar68 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar101);
      local_620 = vmaxps_avx512vl(local_240,auVar101);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_640 = vmulps_avx512vl(local_620,auVar26);
      vandps_avx512vl(auVar115,auVar101);
      uVar64 = vcmpps_avx512vl(local_640,local_640,1);
      uVar69 = uVar69 & uVar64;
      bVar63 = (byte)uVar69;
      if (bVar63 != 0) {
        uVar64 = vcmpps_avx512vl(auVar84,_DAT_01faff00,2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = vblendmps_avx512vl(auVar84,auVar101);
        bVar59 = (byte)uVar64;
        uVar71 = (uint)(bVar59 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar59 & 1) * local_640._0_4_;
        bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
        uVar70 = (uint)bVar68 * auVar114._4_4_ | (uint)!bVar68 * local_640._4_4_;
        bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
        uVar141 = (uint)bVar68 * auVar114._8_4_ | (uint)!bVar68 * local_640._8_4_;
        bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
        uVar142 = (uint)bVar68 * auVar114._12_4_ | (uint)!bVar68 * local_640._12_4_;
        bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
        uVar143 = (uint)bVar68 * auVar114._16_4_ | (uint)!bVar68 * local_640._16_4_;
        bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
        uVar144 = (uint)bVar68 * auVar114._20_4_ | (uint)!bVar68 * local_640._20_4_;
        bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
        uVar145 = (uint)bVar68 * auVar114._24_4_ | (uint)!bVar68 * local_640._24_4_;
        bVar68 = SUB81(uVar64 >> 7,0);
        uVar146 = (uint)bVar68 * auVar114._28_4_ | (uint)!bVar68 * local_640._28_4_;
        auVar125._0_4_ = (bVar63 & 1) * uVar71 | !(bool)(bVar63 & 1) * auVar125._0_4_;
        bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar125._4_4_ = bVar68 * uVar70 | !bVar68 * auVar125._4_4_;
        bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar125._8_4_ = bVar68 * uVar141 | !bVar68 * auVar125._8_4_;
        bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar125._12_4_ = bVar68 * uVar142 | !bVar68 * auVar125._12_4_;
        bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar125._16_4_ = bVar68 * uVar143 | !bVar68 * auVar125._16_4_;
        bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar125._20_4_ = bVar68 * uVar144 | !bVar68 * auVar125._20_4_;
        bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar125._24_4_ = bVar68 * uVar145 | !bVar68 * auVar125._24_4_;
        bVar68 = SUB81(uVar69 >> 7,0);
        auVar125._28_4_ = bVar68 * uVar146 | !bVar68 * auVar125._28_4_;
        auVar84 = vblendmps_avx512vl(auVar101,auVar84);
        bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar64 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar64 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar64 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
        bVar11 = SUB81(uVar64 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar63 & 1) *
             ((uint)(bVar59 & 1) * auVar84._0_4_ | !(bool)(bVar59 & 1) * uVar71) |
             !(bool)(bVar63 & 1) * auVar126._0_4_;
        bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar5 * ((uint)bVar68 * auVar84._4_4_ | !bVar68 * uVar70) |
             !bVar5 * auVar126._4_4_;
        bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar68 * ((uint)bVar6 * auVar84._8_4_ | !bVar6 * uVar141) |
             !bVar68 * auVar126._8_4_;
        bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar68 * ((uint)bVar7 * auVar84._12_4_ | !bVar7 * uVar142) |
             !bVar68 * auVar126._12_4_;
        bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar68 * ((uint)bVar8 * auVar84._16_4_ | !bVar8 * uVar143) |
             !bVar68 * auVar126._16_4_;
        bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar68 * ((uint)bVar9 * auVar84._20_4_ | !bVar9 * uVar144) |
             !bVar68 * auVar126._20_4_;
        bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar68 * ((uint)bVar10 * auVar84._24_4_ | !bVar10 * uVar145) |
             !bVar68 * auVar126._24_4_;
        bVar68 = SUB81(uVar69 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar68 * ((uint)bVar11 * auVar84._28_4_ | !bVar11 * uVar146) |
             !bVar68 * auVar126._28_4_;
        bVar56 = (~bVar63 | bVar59) & bVar56;
      }
      if ((bVar56 & 0x7f) == 0) {
        auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
      }
      else {
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar114 = vxorps_avx512vl(auVar112,auVar84);
        auVar110 = vxorps_avx512vl(auVar110,auVar84);
        uVar71 = *(uint *)(ray + k * 4 + 0x100);
        auVar111 = vxorps_avx512vl(auVar111,auVar84);
        auVar74 = vsubss_avx512f(ZEXT416(uVar71),ZEXT416((uint)local_6b0._0_4_));
        auVar101 = vbroadcastss_avx512vl(auVar74);
        auVar115 = vminps_avx512vl(auVar101,auVar126);
        auVar54._4_4_ = fStack_2bc;
        auVar54._0_4_ = local_2c0;
        auVar54._8_4_ = fStack_2b8;
        auVar54._12_4_ = fStack_2b4;
        auVar54._16_4_ = fStack_2b0;
        auVar54._20_4_ = fStack_2ac;
        auVar54._24_4_ = fStack_2a8;
        auVar54._28_4_ = fStack_2a4;
        auVar112 = vmaxps_avx512vl(auVar54,auVar125);
        auVar101 = vmulps_avx512vl(auVar35,auVar119);
        auVar101 = vfmadd213ps_avx512vl(auVar118,auVar34,auVar101);
        auVar74 = vfmadd213ps_fma(auVar116,auVar33,auVar101);
        auVar101 = vmulps_avx512vl(local_5c0,auVar35);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_5a0,auVar34);
        auVar75 = vfmadd231ps_fma(auVar101,_local_580,auVar33);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar75),auVar116);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar116,auVar118,1);
        auVar119 = vxorps_avx512vl(ZEXT1632(auVar74),auVar84);
        auVar120 = vrcp14ps_avx512vl(ZEXT1632(auVar75));
        auVar227 = ZEXT1632(auVar75);
        auVar127 = vxorps_avx512vl(auVar227,auVar84);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar128 = vfnmadd213ps_avx512vl(auVar120,auVar227,auVar101);
        auVar74 = vfmadd132ps_fma(auVar128,auVar120,auVar120);
        fVar250 = auVar74._0_4_ * auVar119._0_4_;
        fVar254 = auVar74._4_4_ * auVar119._4_4_;
        auVar38._4_4_ = fVar254;
        auVar38._0_4_ = fVar250;
        fVar255 = auVar74._8_4_ * auVar119._8_4_;
        auVar38._8_4_ = fVar255;
        fVar256 = auVar74._12_4_ * auVar119._12_4_;
        auVar38._12_4_ = fVar256;
        fVar230 = auVar119._16_4_ * 0.0;
        auVar38._16_4_ = fVar230;
        fVar231 = auVar119._20_4_ * 0.0;
        auVar38._20_4_ = fVar231;
        fVar216 = auVar119._24_4_ * 0.0;
        auVar38._24_4_ = fVar216;
        auVar38._28_4_ = auVar119._28_4_;
        uVar17 = vcmpps_avx512vl(auVar227,auVar127,1);
        bVar63 = (byte)uVar16 | (byte)uVar17;
        auVar266._8_4_ = 0xff800000;
        auVar266._0_8_ = 0xff800000ff800000;
        auVar266._12_4_ = 0xff800000;
        auVar266._16_4_ = 0xff800000;
        auVar266._20_4_ = 0xff800000;
        auVar266._24_4_ = 0xff800000;
        auVar266._28_4_ = 0xff800000;
        auVar128 = vblendmps_avx512vl(auVar38,auVar266);
        auVar129._0_4_ =
             (uint)(bVar63 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar120._0_4_;
        bVar68 = (bool)(bVar63 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar68 * auVar128._4_4_ | (uint)!bVar68 * auVar120._4_4_;
        bVar68 = (bool)(bVar63 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar68 * auVar128._8_4_ | (uint)!bVar68 * auVar120._8_4_;
        bVar68 = (bool)(bVar63 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar68 * auVar128._12_4_ | (uint)!bVar68 * auVar120._12_4_;
        bVar68 = (bool)(bVar63 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar68 * auVar128._16_4_ | (uint)!bVar68 * auVar120._16_4_;
        bVar68 = (bool)(bVar63 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar68 * auVar128._20_4_ | (uint)!bVar68 * auVar120._20_4_;
        bVar68 = (bool)(bVar63 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar68 * auVar128._24_4_ | (uint)!bVar68 * auVar120._24_4_;
        auVar129._28_4_ =
             (uint)(bVar63 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar120._28_4_;
        auVar112 = vmaxps_avx512vl(auVar112,auVar129);
        auVar265 = ZEXT3264(auVar112);
        uVar17 = vcmpps_avx512vl(auVar227,auVar127,6);
        bVar63 = (byte)uVar16 | (byte)uVar17;
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar130._0_4_ =
             (uint)(bVar63 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)fVar250;
        bVar68 = (bool)(bVar63 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar68 * auVar120._4_4_ | (uint)!bVar68 * (int)fVar254;
        bVar68 = (bool)(bVar63 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar68 * auVar120._8_4_ | (uint)!bVar68 * (int)fVar255;
        bVar68 = (bool)(bVar63 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar68 * auVar120._12_4_ | (uint)!bVar68 * (int)fVar256;
        bVar68 = (bool)(bVar63 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar68 * auVar120._16_4_ | (uint)!bVar68 * (int)fVar230;
        bVar68 = (bool)(bVar63 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar68 * auVar120._20_4_ | (uint)!bVar68 * (int)fVar231;
        bVar68 = (bool)(bVar63 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar68 * auVar120._24_4_ | (uint)!bVar68 * (int)fVar216;
        auVar130._28_4_ =
             (uint)(bVar63 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar119._28_4_;
        auVar119 = vminps_avx512vl(auVar115,auVar130);
        auVar74 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
        auVar106 = vsubps_avx512vl(ZEXT1632(auVar74),auVar106);
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar74),auVar107);
        auVar115 = ZEXT1632(auVar74);
        auVar108 = vsubps_avx512vl(auVar115,auVar108);
        auVar108 = vmulps_avx512vl(auVar108,auVar114);
        auVar107 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar107);
        auVar106 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar106);
        auVar107 = vmulps_avx512vl(local_5c0,auVar114);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_5a0,auVar111);
        auVar107 = vfmadd231ps_avx512vl(auVar107,_local_580,auVar110);
        vandps_avx512vl(auVar107,auVar116);
        uVar16 = vcmpps_avx512vl(auVar107,auVar118,1);
        auVar106 = vxorps_avx512vl(auVar106,auVar84);
        auVar108 = vrcp14ps_avx512vl(auVar107);
        auVar84 = vxorps_avx512vl(auVar107,auVar84);
        auVar262 = ZEXT3264(auVar84);
        auVar110 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar101);
        auVar74 = vfmadd132ps_fma(auVar110,auVar108,auVar108);
        fVar250 = auVar74._0_4_ * auVar106._0_4_;
        fVar254 = auVar74._4_4_ * auVar106._4_4_;
        auVar39._4_4_ = fVar254;
        auVar39._0_4_ = fVar250;
        fVar255 = auVar74._8_4_ * auVar106._8_4_;
        auVar39._8_4_ = fVar255;
        fVar256 = auVar74._12_4_ * auVar106._12_4_;
        auVar39._12_4_ = fVar256;
        fVar230 = auVar106._16_4_ * 0.0;
        auVar39._16_4_ = fVar230;
        fVar231 = auVar106._20_4_ * 0.0;
        auVar39._20_4_ = fVar231;
        fVar216 = auVar106._24_4_ * 0.0;
        auVar39._24_4_ = fVar216;
        auVar39._28_4_ = auVar106._28_4_;
        uVar17 = vcmpps_avx512vl(auVar107,auVar84,1);
        bVar63 = (byte)uVar16 | (byte)uVar17;
        auVar110 = vblendmps_avx512vl(auVar39,auVar266);
        auVar131._0_4_ =
             (uint)(bVar63 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
        bVar68 = (bool)(bVar63 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar68 * auVar110._4_4_ | (uint)!bVar68 * auVar108._4_4_;
        bVar68 = (bool)(bVar63 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar68 * auVar110._8_4_ | (uint)!bVar68 * auVar108._8_4_;
        bVar68 = (bool)(bVar63 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar68 * auVar110._12_4_ | (uint)!bVar68 * auVar108._12_4_;
        bVar68 = (bool)(bVar63 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar68 * auVar110._16_4_ | (uint)!bVar68 * auVar108._16_4_;
        bVar68 = (bool)(bVar63 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar68 * auVar110._20_4_ | (uint)!bVar68 * auVar108._20_4_;
        bVar68 = (bool)(bVar63 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar68 * auVar110._24_4_ | (uint)!bVar68 * auVar108._24_4_;
        auVar131._28_4_ =
             (uint)(bVar63 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar108._28_4_;
        _local_7e0 = vmaxps_avx(auVar112,auVar131);
        auVar253 = ZEXT3264(_local_7e0);
        uVar17 = vcmpps_avx512vl(auVar107,auVar84,6);
        bVar63 = (byte)uVar16 | (byte)uVar17;
        auVar132._0_4_ =
             (uint)(bVar63 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)fVar250;
        bVar68 = (bool)(bVar63 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar68 * auVar120._4_4_ | (uint)!bVar68 * (int)fVar254;
        bVar68 = (bool)(bVar63 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar68 * auVar120._8_4_ | (uint)!bVar68 * (int)fVar255;
        bVar68 = (bool)(bVar63 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar68 * auVar120._12_4_ | (uint)!bVar68 * (int)fVar256;
        bVar68 = (bool)(bVar63 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar68 * auVar120._16_4_ | (uint)!bVar68 * (int)fVar230;
        bVar68 = (bool)(bVar63 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar68 * auVar120._20_4_ | (uint)!bVar68 * (int)fVar231;
        bVar68 = (bool)(bVar63 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar68 * auVar120._24_4_ | (uint)!bVar68 * (int)fVar216;
        auVar132._28_4_ =
             (uint)(bVar63 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar106._28_4_;
        local_340 = vminps_avx(auVar119,auVar132);
        auVar258 = ZEXT3264(local_340);
        uVar16 = vcmpps_avx512vl(_local_7e0,local_340,2);
        bVar56 = bVar56 & 0x7f & (byte)uVar16;
        if (bVar56 == 0) goto LAB_01d741b1;
        auVar84 = vmaxps_avx512vl(auVar115,auVar83);
        auVar83 = vfmadd213ps_avx512vl(auVar105,auVar121,auVar113);
        auVar83 = vmulps_avx512vl(auVar109,auVar83);
        auVar105 = vfmadd213ps_avx512vl(local_5e0,auVar121,auVar113);
        auVar40._4_4_ = auVar109._4_4_ * auVar105._4_4_;
        auVar40._0_4_ = auVar109._0_4_ * auVar105._0_4_;
        auVar40._8_4_ = auVar109._8_4_ * auVar105._8_4_;
        auVar40._12_4_ = auVar109._12_4_ * auVar105._12_4_;
        auVar40._16_4_ = auVar109._16_4_ * auVar105._16_4_;
        auVar40._20_4_ = auVar109._20_4_ * auVar105._20_4_;
        auVar40._24_4_ = auVar109._24_4_ * auVar105._24_4_;
        auVar40._28_4_ = auVar131._28_4_;
        auVar83 = vminps_avx512vl(auVar83,auVar101);
        auVar49 = ZEXT812(0);
        auVar105 = ZEXT1232(auVar49) << 0x20;
        auVar83 = vmaxps_avx(auVar83,ZEXT1232(auVar49) << 0x20);
        auVar106 = vminps_avx512vl(auVar40,auVar101);
        auVar41._4_4_ = (auVar83._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar83._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar83._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar83._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar83._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar83._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar83._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar83._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar41,auVar157,auVar235);
        auVar83 = vmaxps_avx(auVar106,ZEXT1232(auVar49) << 0x20);
        auVar42._4_4_ = (auVar83._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar83._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar83._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar83._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar83._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar83._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar83._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar83._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar42,auVar157,auVar235);
        auVar43._4_4_ = auVar84._4_4_ * auVar84._4_4_;
        auVar43._0_4_ = auVar84._0_4_ * auVar84._0_4_;
        auVar43._8_4_ = auVar84._8_4_ * auVar84._8_4_;
        auVar43._12_4_ = auVar84._12_4_ * auVar84._12_4_;
        auVar43._16_4_ = auVar84._16_4_ * auVar84._16_4_;
        auVar43._20_4_ = auVar84._20_4_ * auVar84._20_4_;
        auVar43._24_4_ = auVar84._24_4_ * auVar84._24_4_;
        auVar43._28_4_ = auVar84._28_4_;
        auVar83 = vsubps_avx(local_7c0,auVar43);
        local_8a0 = auVar117._0_4_;
        fStack_89c = auVar117._4_4_;
        fStack_898 = auVar117._8_4_;
        fStack_894 = auVar117._12_4_;
        fStack_890 = auVar117._16_4_;
        fStack_88c = auVar117._20_4_;
        fStack_888 = auVar117._24_4_;
        auVar44._4_4_ = auVar83._4_4_ * fStack_89c;
        auVar44._0_4_ = auVar83._0_4_ * local_8a0;
        auVar44._8_4_ = auVar83._8_4_ * fStack_898;
        auVar44._12_4_ = auVar83._12_4_ * fStack_894;
        auVar44._16_4_ = auVar83._16_4_ * fStack_890;
        auVar44._20_4_ = auVar83._20_4_ * fStack_88c;
        auVar44._24_4_ = auVar83._24_4_ * fStack_888;
        auVar44._28_4_ = auVar84._28_4_;
        auVar84 = vsubps_avx(local_700,auVar44);
        uVar16 = vcmpps_avx512vl(auVar84,ZEXT1232(auVar49) << 0x20,5);
        bVar63 = (byte)uVar16;
        if (bVar63 == 0) {
          bVar63 = 0;
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar244 = ZEXT864(0) << 0x20;
          auVar84 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar260 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar133._8_4_ = 0x7f800000;
          auVar133._0_8_ = 0x7f8000007f800000;
          auVar133._12_4_ = 0x7f800000;
          auVar133._16_4_ = 0x7f800000;
          auVar133._20_4_ = 0x7f800000;
          auVar133._24_4_ = 0x7f800000;
          auVar133._28_4_ = 0x7f800000;
          auVar134._8_4_ = 0xff800000;
          auVar134._0_8_ = 0xff800000ff800000;
          auVar134._12_4_ = 0xff800000;
          auVar134._16_4_ = 0xff800000;
          auVar134._20_4_ = 0xff800000;
          auVar134._24_4_ = 0xff800000;
          auVar134._28_4_ = 0xff800000;
        }
        else {
          auVar75 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
          uVar69 = vcmpps_avx512vl(auVar84,auVar115,5);
          auVar84 = vsqrtps_avx(auVar84);
          auVar101 = vfnmadd213ps_avx512vl(auVar123,auVar124,auVar101);
          auVar105 = vfmadd132ps_avx512vl(auVar101,auVar124,auVar124);
          auVar101 = vsubps_avx(_local_600,auVar84);
          auVar107 = vmulps_avx512vl(auVar101,auVar105);
          auVar84 = vsubps_avx512vl(auVar84,auVar122);
          auVar108 = vmulps_avx512vl(auVar84,auVar105);
          auVar84 = vfmadd213ps_avx512vl(auVar121,auVar107,auVar113);
          auVar45._4_4_ = auVar109._4_4_ * auVar84._4_4_;
          auVar45._0_4_ = auVar109._0_4_ * auVar84._0_4_;
          auVar45._8_4_ = auVar109._8_4_ * auVar84._8_4_;
          auVar45._12_4_ = auVar109._12_4_ * auVar84._12_4_;
          auVar45._16_4_ = auVar109._16_4_ * auVar84._16_4_;
          auVar45._20_4_ = auVar109._20_4_ * auVar84._20_4_;
          auVar45._24_4_ = auVar109._24_4_ * auVar84._24_4_;
          auVar45._28_4_ = auVar106._28_4_;
          auVar46._4_4_ = (float)local_580._4_4_ * auVar107._4_4_;
          auVar46._0_4_ = (float)local_580._0_4_ * auVar107._0_4_;
          auVar46._8_4_ = fStack_578 * auVar107._8_4_;
          auVar46._12_4_ = fStack_574 * auVar107._12_4_;
          auVar46._16_4_ = fStack_570 * auVar107._16_4_;
          auVar46._20_4_ = fStack_56c * auVar107._20_4_;
          auVar46._24_4_ = fStack_568 * auVar107._24_4_;
          auVar46._28_4_ = auVar84._28_4_;
          auVar101 = vmulps_avx512vl(local_5a0,auVar107);
          auVar106 = vmulps_avx512vl(local_5c0,auVar107);
          auVar84 = vfmadd213ps_avx512vl(auVar98,auVar45,auVar102);
          auVar84 = vsubps_avx512vl(auVar46,auVar84);
          auVar105 = vfmadd213ps_avx512vl(auVar99,auVar45,auVar103);
          auVar101 = vsubps_avx512vl(auVar101,auVar105);
          auVar74 = vfmadd213ps_fma(auVar45,auVar100,auVar104);
          auVar105 = vsubps_avx(auVar106,ZEXT1632(auVar74));
          auVar260 = auVar105._0_28_;
          auVar105 = vfmadd213ps_avx512vl(auVar121,auVar108,auVar113);
          auVar109 = vmulps_avx512vl(auVar109,auVar105);
          auVar47._4_4_ = (float)local_580._4_4_ * auVar108._4_4_;
          auVar47._0_4_ = (float)local_580._0_4_ * auVar108._0_4_;
          auVar47._8_4_ = fStack_578 * auVar108._8_4_;
          auVar47._12_4_ = fStack_574 * auVar108._12_4_;
          auVar47._16_4_ = fStack_570 * auVar108._16_4_;
          auVar47._20_4_ = fStack_56c * auVar108._20_4_;
          auVar47._24_4_ = fStack_568 * auVar108._24_4_;
          auVar47._28_4_ = auVar106._28_4_;
          auVar106 = vmulps_avx512vl(local_5a0,auVar108);
          auVar110 = vmulps_avx512vl(local_5c0,auVar108);
          auVar74 = vfmadd213ps_fma(auVar98,auVar109,auVar102);
          auVar105 = vsubps_avx(auVar47,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar99,auVar109,auVar103);
          auVar98 = vsubps_avx512vl(auVar106,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar100,auVar109,auVar104);
          auVar99 = vsubps_avx512vl(auVar110,ZEXT1632(auVar74));
          auVar244 = ZEXT3264(auVar99);
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar99 = vblendmps_avx512vl(auVar158,auVar107);
          bVar68 = (bool)((byte)uVar69 & 1);
          auVar133._0_4_ = (uint)bVar68 * auVar99._0_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar133._16_4_ = (uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar133._20_4_ = (uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar133._24_4_ = (uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = SUB81(uVar69 >> 7,0);
          auVar133._28_4_ = (uint)bVar68 * auVar99._28_4_ | (uint)!bVar68 * 0x7f800000;
          auVar209._8_4_ = 0xff800000;
          auVar209._0_8_ = 0xff800000ff800000;
          auVar209._12_4_ = 0xff800000;
          auVar209._16_4_ = 0xff800000;
          auVar209._20_4_ = 0xff800000;
          auVar209._24_4_ = 0xff800000;
          auVar209._28_4_ = 0xff800000;
          auVar99 = vblendmps_avx512vl(auVar209,auVar108);
          bVar68 = (bool)((byte)uVar69 & 1);
          auVar134._0_4_ = (uint)bVar68 * auVar99._0_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * -0x800000;
          bVar68 = SUB81(uVar69 >> 7,0);
          auVar134._28_4_ = (uint)bVar68 * auVar99._28_4_ | (uint)!bVar68 * -0x800000;
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar99 = vmulps_avx512vl(local_620,auVar27);
          uVar64 = vcmpps_avx512vl(auVar99,local_640,0xe);
          uVar69 = uVar69 & uVar64;
          bVar59 = (byte)uVar69;
          if (bVar59 != 0) {
            uVar64 = vcmpps_avx512vl(auVar83,ZEXT1632(auVar75),2);
            auVar248._8_4_ = 0x7f800000;
            auVar248._0_8_ = 0x7f8000007f800000;
            auVar248._12_4_ = 0x7f800000;
            auVar248._16_4_ = 0x7f800000;
            auVar248._20_4_ = 0x7f800000;
            auVar248._24_4_ = 0x7f800000;
            auVar248._28_4_ = 0x7f800000;
            auVar252._8_4_ = 0xff800000;
            auVar252._0_8_ = 0xff800000ff800000;
            auVar252._12_4_ = 0xff800000;
            auVar252._16_4_ = 0xff800000;
            auVar252._20_4_ = 0xff800000;
            auVar252._24_4_ = 0xff800000;
            auVar252._28_4_ = 0xff800000;
            auVar83 = vblendmps_avx512vl(auVar248,auVar252);
            bVar66 = (byte)uVar64;
            uVar70 = (uint)(bVar66 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar99._0_4_;
            bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
            uVar141 = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * auVar99._4_4_;
            bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
            uVar142 = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * auVar99._8_4_;
            bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
            uVar143 = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * auVar99._12_4_;
            bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
            uVar144 = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * auVar99._16_4_;
            bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
            uVar145 = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * auVar99._20_4_;
            bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
            uVar146 = (uint)bVar68 * auVar83._24_4_ | (uint)!bVar68 * auVar99._24_4_;
            bVar68 = SUB81(uVar64 >> 7,0);
            uVar147 = (uint)bVar68 * auVar83._28_4_ | (uint)!bVar68 * auVar99._28_4_;
            auVar133._0_4_ = (bVar59 & 1) * uVar70 | !(bool)(bVar59 & 1) * auVar133._0_4_;
            bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar133._4_4_ = bVar68 * uVar141 | !bVar68 * auVar133._4_4_;
            bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar133._8_4_ = bVar68 * uVar142 | !bVar68 * auVar133._8_4_;
            bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar133._12_4_ = bVar68 * uVar143 | !bVar68 * auVar133._12_4_;
            bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar133._16_4_ = bVar68 * uVar144 | !bVar68 * auVar133._16_4_;
            bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar133._20_4_ = bVar68 * uVar145 | !bVar68 * auVar133._20_4_;
            bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar133._24_4_ = bVar68 * uVar146 | !bVar68 * auVar133._24_4_;
            bVar68 = SUB81(uVar69 >> 7,0);
            auVar133._28_4_ = bVar68 * uVar147 | !bVar68 * auVar133._28_4_;
            auVar83 = vblendmps_avx512vl(auVar252,auVar248);
            bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar64 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar64 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar64 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar64 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
            bVar11 = SUB81(uVar64 >> 7,0);
            auVar134._0_4_ =
                 (uint)(bVar59 & 1) *
                 ((uint)(bVar66 & 1) * auVar83._0_4_ | !(bool)(bVar66 & 1) * uVar70) |
                 !(bool)(bVar59 & 1) * auVar134._0_4_;
            bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar134._4_4_ =
                 (uint)bVar5 * ((uint)bVar68 * auVar83._4_4_ | !bVar68 * uVar141) |
                 !bVar5 * auVar134._4_4_;
            bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar134._8_4_ =
                 (uint)bVar68 * ((uint)bVar6 * auVar83._8_4_ | !bVar6 * uVar142) |
                 !bVar68 * auVar134._8_4_;
            bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar134._12_4_ =
                 (uint)bVar68 * ((uint)bVar7 * auVar83._12_4_ | !bVar7 * uVar143) |
                 !bVar68 * auVar134._12_4_;
            bVar68 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar134._16_4_ =
                 (uint)bVar68 * ((uint)bVar8 * auVar83._16_4_ | !bVar8 * uVar144) |
                 !bVar68 * auVar134._16_4_;
            bVar68 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar134._20_4_ =
                 (uint)bVar68 * ((uint)bVar9 * auVar83._20_4_ | !bVar9 * uVar145) |
                 !bVar68 * auVar134._20_4_;
            bVar68 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar134._24_4_ =
                 (uint)bVar68 * ((uint)bVar10 * auVar83._24_4_ | !bVar10 * uVar146) |
                 !bVar68 * auVar134._24_4_;
            bVar68 = SUB81(uVar69 >> 7,0);
            auVar134._28_4_ =
                 (uint)bVar68 * ((uint)bVar11 * auVar83._28_4_ | !bVar11 * uVar147) |
                 !bVar68 * auVar134._28_4_;
            bVar63 = (~bVar59 | bVar66) & bVar63;
          }
        }
        auVar265 = ZEXT3264(local_5c0);
        auVar249._0_4_ = local_5c0._0_4_ * auVar244._0_4_;
        auVar249._4_4_ = local_5c0._4_4_ * auVar244._4_4_;
        auVar249._8_4_ = local_5c0._8_4_ * auVar244._8_4_;
        auVar249._12_4_ = local_5c0._12_4_ * auVar244._12_4_;
        auVar249._16_4_ = local_5c0._16_4_ * auVar244._16_4_;
        auVar249._20_4_ = local_5c0._20_4_ * auVar244._20_4_;
        auVar249._28_36_ = auVar244._28_36_;
        auVar249._24_4_ = local_5c0._24_4_ * auVar244._24_4_;
        auVar253 = ZEXT3264(local_5a0);
        auVar74 = vfmadd231ps_fma(auVar249._0_32_,local_5a0,auVar98);
        auVar249 = ZEXT3264(_local_580);
        auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_580,auVar105);
        auVar245._8_4_ = 0x7fffffff;
        auVar245._0_8_ = 0x7fffffff7fffffff;
        auVar245._12_4_ = 0x7fffffff;
        auVar245._16_4_ = 0x7fffffff;
        auVar245._20_4_ = 0x7fffffff;
        auVar245._24_4_ = 0x7fffffff;
        auVar245._28_4_ = 0x7fffffff;
        auVar83 = vandps_avx(ZEXT1632(auVar74),auVar245);
        auVar262 = ZEXT3264(_local_7e0);
        _local_1c0 = _local_7e0;
        auVar243._8_4_ = 0x3e99999a;
        auVar243._0_8_ = 0x3e99999a3e99999a;
        auVar243._12_4_ = 0x3e99999a;
        auVar243._16_4_ = 0x3e99999a;
        auVar243._20_4_ = 0x3e99999a;
        auVar243._24_4_ = 0x3e99999a;
        auVar243._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar83,auVar243,1);
        local_560._0_2_ = (short)uVar16;
        local_360 = vmaxps_avx(_local_7e0,auVar134);
        auVar83 = vminps_avx(local_340,auVar133);
        uVar16 = vcmpps_avx512vl(_local_7e0,auVar83,2);
        bVar59 = (byte)uVar16 & bVar56;
        uVar17 = vcmpps_avx512vl(local_360,local_340,2);
        if ((bVar56 & ((byte)uVar17 | (byte)uVar16)) == 0) {
          auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          auVar48._4_4_ = local_5c0._4_4_ * auVar260._4_4_;
          auVar48._0_4_ = local_5c0._0_4_ * auVar260._0_4_;
          auVar48._8_4_ = local_5c0._8_4_ * auVar260._8_4_;
          auVar48._12_4_ = local_5c0._12_4_ * auVar260._12_4_;
          auVar48._16_4_ = local_5c0._16_4_ * auVar260._16_4_;
          auVar48._20_4_ = local_5c0._20_4_ * auVar260._20_4_;
          auVar48._24_4_ = local_5c0._24_4_ * auVar260._24_4_;
          auVar48._28_4_ = auVar83._28_4_;
          auVar74 = vfmadd213ps_fma(auVar101,local_5a0,auVar48);
          auVar74 = vfmadd213ps_fma(auVar84,_local_580,ZEXT1632(auVar74));
          auVar83 = vandps_avx(ZEXT1632(auVar74),auVar245);
          uVar16 = vcmpps_avx512vl(auVar83,auVar243,1);
          bVar66 = (byte)uVar16 | ~bVar63;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar83 = vpblendmd_avx512vl(auVar160,auVar28);
          local_300._0_4_ = (uint)(bVar66 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
          bVar68 = (bool)(bVar66 >> 1 & 1);
          local_300._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar66 >> 2 & 1);
          local_300._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar66 >> 3 & 1);
          local_300._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar66 >> 4 & 1);
          local_300._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar66 >> 5 & 1);
          local_300._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar66 >> 6 & 1);
          local_300._24_4_ = (uint)bVar68 * auVar83._24_4_ | (uint)!bVar68 * 2;
          local_300._28_4_ = (uint)(bVar66 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_4e0,local_300,5);
          bVar66 = (byte)uVar16 & bVar59;
          auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          if (bVar66 == 0) {
            auVar162._4_4_ = uVar71;
            auVar162._0_4_ = uVar71;
            auVar162._8_4_ = uVar71;
            auVar162._12_4_ = uVar71;
            auVar162._16_4_ = uVar71;
            auVar162._20_4_ = uVar71;
            auVar162._24_4_ = uVar71;
            auVar162._28_4_ = uVar71;
            auVar83 = local_360;
          }
          else {
            local_320 = local_360;
            auVar75 = vminps_avx(local_720._0_16_,local_760._0_16_);
            auVar74 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
            auVar72 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar1 = vminps_avx(auVar75,auVar72);
            auVar75 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar72 = vmaxps_avx(auVar74,auVar75);
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx(auVar1,auVar189);
            auVar75 = vandps_avx(auVar72,auVar189);
            auVar74 = vmaxps_avx(auVar74,auVar75);
            auVar75 = vmovshdup_avx(auVar74);
            auVar75 = vmaxss_avx(auVar75,auVar74);
            auVar74 = vshufpd_avx(auVar74,auVar74,1);
            auVar74 = vmaxss_avx(auVar74,auVar75);
            fVar250 = auVar74._0_4_ * 1.9073486e-06;
            local_6a0 = vshufps_avx(auVar72,auVar72,0xff);
            local_540 = (float)local_7e0._0_4_ + fVar164;
            fStack_53c = (float)local_7e0._4_4_ + fVar164;
            fStack_538 = fStack_7d8 + fVar164;
            fStack_534 = fStack_7d4 + fVar164;
            fStack_530 = fStack_7d0 + fVar164;
            fStack_52c = fStack_7cc + fVar164;
            fStack_528 = fStack_7c8 + fVar164;
            fStack_524 = fStack_7c4 + fVar164;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar83 = vblendmps_avx512vl(auVar161,_local_7e0);
              auVar136._0_4_ =
                   (uint)(bVar66 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
              bVar68 = (bool)(bVar66 >> 1 & 1);
              auVar136._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar66 >> 2 & 1);
              auVar136._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar66 >> 3 & 1);
              auVar136._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar66 >> 4 & 1);
              auVar136._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar66 >> 5 & 1);
              auVar136._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * 0x7f800000;
              auVar136._24_4_ =
                   (uint)(bVar66 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar83 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar83 = vminps_avx(auVar136,auVar83);
              auVar84 = vshufpd_avx(auVar83,auVar83,5);
              auVar83 = vminps_avx(auVar83,auVar84);
              auVar84 = vpermpd_avx2(auVar83,0x4e);
              auVar83 = vminps_avx(auVar83,auVar84);
              uVar16 = vcmpps_avx512vl(auVar136,auVar83,0);
              bVar57 = (byte)uVar16 & bVar66;
              bVar58 = bVar66;
              if (bVar57 != 0) {
                bVar58 = bVar57;
              }
              iVar19 = 0;
              for (uVar71 = (uint)bVar58; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar71 = *(uint *)(local_1e0 + (uint)(iVar19 << 2));
              uVar70 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
              fVar254 = auVar14._0_4_;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar254 = sqrtf((float)local_7a0._0_4_);
              }
              auVar74 = vinsertps_avx(ZEXT416(uVar70),ZEXT416(uVar71),0x10);
              auVar258 = ZEXT1664(auVar74);
              bVar68 = true;
              uVar69 = 0;
              do {
                uVar171 = auVar258._0_4_;
                auVar150._4_4_ = uVar171;
                auVar150._0_4_ = uVar171;
                auVar150._8_4_ = uVar171;
                auVar150._12_4_ = uVar171;
                auVar74 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_790);
                local_700 = auVar258._0_32_;
                auVar75 = vmovshdup_avx(auVar258._0_16_);
                fVar240 = auVar75._0_4_;
                fVar267 = 1.0 - fVar240;
                fVar256 = fVar267 * fVar267 * fVar267;
                fVar216 = fVar240 * fVar240 * fVar240;
                auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar256),
                                          ZEXT416((uint)fVar216));
                fVar255 = fVar240 * fVar267;
                auVar232 = ZEXT416((uint)fVar267);
                auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * fVar240 * 6.0)),
                                          ZEXT416((uint)(fVar255 * fVar267)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                         ZEXT416((uint)fVar256));
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * fVar267 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar255 * fVar240)));
                fVar256 = fVar256 * 0.16666667;
                fVar230 = (auVar72._0_4_ + auVar76._0_4_) * 0.16666667;
                fVar231 = (auVar1._0_4_ + auVar73._0_4_) * 0.16666667;
                fVar216 = fVar216 * 0.16666667;
                auVar190._0_4_ = fVar216 * (float)local_780._0_4_;
                auVar190._4_4_ = fVar216 * (float)local_780._4_4_;
                auVar190._8_4_ = fVar216 * fStack_778;
                auVar190._12_4_ = fVar216 * fStack_774;
                auVar233._4_4_ = fVar231;
                auVar233._0_4_ = fVar231;
                auVar233._8_4_ = fVar231;
                auVar233._12_4_ = fVar231;
                auVar72 = vfmadd132ps_fma(auVar233,auVar190,local_740._0_16_);
                auVar191._4_4_ = fVar230;
                auVar191._0_4_ = fVar230;
                auVar191._8_4_ = fVar230;
                auVar191._12_4_ = fVar230;
                auVar72 = vfmadd132ps_fma(auVar191,auVar72,local_760._0_16_);
                auVar173._4_4_ = fVar256;
                auVar173._0_4_ = fVar256;
                auVar173._8_4_ = fVar256;
                auVar173._12_4_ = fVar256;
                auVar72 = vfmadd132ps_fma(auVar173,auVar72,local_720._0_16_);
                local_5e0._0_16_ = auVar72;
                auVar72 = vsubps_avx(auVar74,auVar72);
                auVar74 = vdpps_avx(auVar72,auVar72,0x7f);
                local_7c0._0_16_ = auVar74;
                if (auVar74._0_4_ < 0.0) {
                  auVar244._0_4_ = sqrtf(auVar74._0_4_);
                  auVar244._4_60_ = extraout_var;
                  auVar74 = auVar244._0_16_;
                }
                else {
                  auVar74 = vsqrtss_avx(auVar74,auVar74);
                }
                local_600._4_4_ = fVar267;
                local_600._0_4_ = fVar267;
                fStack_5f8 = fVar267;
                fStack_5f4 = fVar267;
                auVar76 = vfnmsub213ss_fma(auVar75,auVar75,ZEXT416((uint)(fVar255 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * 4.0)),auVar232,auVar232);
                fVar255 = fVar267 * -fVar267 * 0.5;
                fVar256 = auVar76._0_4_ * 0.5;
                fVar230 = auVar1._0_4_ * 0.5;
                fVar231 = fVar240 * fVar240 * 0.5;
                auVar217._0_4_ = fVar231 * (float)local_780._0_4_;
                auVar217._4_4_ = fVar231 * (float)local_780._4_4_;
                auVar217._8_4_ = fVar231 * fStack_778;
                auVar217._12_4_ = fVar231 * fStack_774;
                auVar174._4_4_ = fVar230;
                auVar174._0_4_ = fVar230;
                auVar174._8_4_ = fVar230;
                auVar174._12_4_ = fVar230;
                auVar1 = vfmadd132ps_fma(auVar174,auVar217,local_740._0_16_);
                auVar192._4_4_ = fVar256;
                auVar192._0_4_ = fVar256;
                auVar192._8_4_ = fVar256;
                auVar192._12_4_ = fVar256;
                auVar1 = vfmadd132ps_fma(auVar192,auVar1,local_760._0_16_);
                auVar263._4_4_ = fVar255;
                auVar263._0_4_ = fVar255;
                auVar263._8_4_ = fVar255;
                auVar263._12_4_ = fVar255;
                auVar1 = vfmadd132ps_fma(auVar263,auVar1,local_720._0_16_);
                local_620._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
                auVar50._12_4_ = 0;
                auVar50._0_12_ = ZEXT812(0);
                fVar255 = local_620._0_4_;
                auVar76 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar255));
                fVar256 = auVar76._0_4_;
                local_640._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar255));
                auVar76 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                uVar71 = auVar74._0_4_;
                if (fVar255 < -fVar255) {
                  fVar230 = sqrtf(fVar255);
                  auVar74 = ZEXT416(uVar71);
                }
                else {
                  auVar73 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                  fVar230 = auVar73._0_4_;
                }
                fVar255 = fVar256 * 1.5 + fVar255 * -0.5 * fVar256 * fVar256 * fVar256;
                auVar151._0_4_ = auVar1._0_4_ * fVar255;
                auVar151._4_4_ = auVar1._4_4_ * fVar255;
                auVar151._8_4_ = auVar1._8_4_ * fVar255;
                auVar151._12_4_ = auVar1._12_4_ * fVar255;
                auVar73 = vdpps_avx(auVar72,auVar151,0x7f);
                fVar216 = auVar74._0_4_;
                fVar256 = auVar73._0_4_;
                auVar152._0_4_ = fVar256 * fVar256;
                auVar152._4_4_ = auVar73._4_4_ * auVar73._4_4_;
                auVar152._8_4_ = auVar73._8_4_ * auVar73._8_4_;
                auVar152._12_4_ = auVar73._12_4_ * auVar73._12_4_;
                auVar80 = vsubps_avx(local_7c0._0_16_,auVar152);
                fVar231 = auVar80._0_4_;
                auVar175._4_12_ = ZEXT812(0) << 0x20;
                auVar175._0_4_ = fVar231;
                auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
                auVar78 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
                auVar79 = vmulss_avx512f(auVar80,ZEXT416(0xbf000000));
                if (fVar231 < 0.0) {
                  local_660._0_4_ = fVar230;
                  local_680._0_4_ = auVar78._0_4_;
                  local_690._4_4_ = fVar255;
                  local_690._0_4_ = fVar255;
                  fStack_688 = fVar255;
                  fStack_684 = fVar255;
                  local_670 = auVar77;
                  fVar231 = sqrtf(fVar231);
                  auVar79 = ZEXT416(auVar79._0_4_);
                  auVar78 = ZEXT416((uint)local_680._0_4_);
                  auVar74 = ZEXT416(uVar71);
                  auVar77 = local_670;
                  fVar255 = (float)local_690._0_4_;
                  fVar267 = (float)local_690._4_4_;
                  fVar240 = fStack_688;
                  fVar268 = fStack_684;
                  fVar230 = (float)local_660._0_4_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar231 = auVar80._0_4_;
                  fVar267 = fVar255;
                  fVar240 = fVar255;
                  fVar268 = fVar255;
                }
                auVar265 = ZEXT1664(auVar1);
                auVar262 = ZEXT1664(local_7c0._0_16_);
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar232,auVar75);
                auVar232 = vfmadd213ss_fma(auVar75,SUB6416(ZEXT464(0xc0000000),0),auVar232);
                auVar82 = local_700._0_16_;
                auVar75 = vshufps_avx(auVar82,auVar82,0x55);
                auVar193._0_4_ = auVar75._0_4_ * (float)local_780._0_4_;
                auVar193._4_4_ = auVar75._4_4_ * (float)local_780._4_4_;
                auVar193._8_4_ = auVar75._8_4_ * fStack_778;
                auVar193._12_4_ = auVar75._12_4_ * fStack_774;
                auVar218._0_4_ = auVar232._0_4_;
                auVar218._4_4_ = auVar218._0_4_;
                auVar218._8_4_ = auVar218._0_4_;
                auVar218._12_4_ = auVar218._0_4_;
                auVar75 = vfmadd132ps_fma(auVar218,auVar193,local_740._0_16_);
                auVar176._0_4_ = auVar80._0_4_;
                auVar176._4_4_ = auVar176._0_4_;
                auVar176._8_4_ = auVar176._0_4_;
                auVar176._12_4_ = auVar176._0_4_;
                auVar75 = vfmadd132ps_fma(auVar176,auVar75,local_760._0_16_);
                auVar75 = vfmadd132ps_fma(_local_600,auVar75,local_720._0_16_);
                auVar177._0_4_ = auVar75._0_4_ * (float)local_620._0_4_;
                auVar177._4_4_ = auVar75._4_4_ * (float)local_620._0_4_;
                auVar177._8_4_ = auVar75._8_4_ * (float)local_620._0_4_;
                auVar177._12_4_ = auVar75._12_4_ * (float)local_620._0_4_;
                auVar75 = vdpps_avx(auVar1,auVar75,0x7f);
                fVar188 = auVar75._0_4_;
                auVar194._0_4_ = auVar1._0_4_ * fVar188;
                auVar194._4_4_ = auVar1._4_4_ * fVar188;
                auVar194._8_4_ = auVar1._8_4_ * fVar188;
                auVar194._12_4_ = auVar1._12_4_ * fVar188;
                auVar75 = vsubps_avx(auVar177,auVar194);
                fVar188 = auVar76._0_4_ * (float)local_640._0_4_;
                auVar232 = vmaxss_avx(ZEXT416((uint)fVar250),
                                      ZEXT416((uint)(local_700._0_4_ * fVar254 * 1.9073486e-06)));
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar1,auVar20);
                auVar195._0_4_ = fVar255 * auVar75._0_4_ * fVar188;
                auVar195._4_4_ = fVar267 * auVar75._4_4_ * fVar188;
                auVar195._8_4_ = fVar240 * auVar75._8_4_ * fVar188;
                auVar195._12_4_ = fVar268 * auVar75._12_4_ * fVar188;
                auVar75 = vdpps_avx(auVar80,auVar151,0x7f);
                auVar76 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar250),auVar232);
                auVar74 = vdpps_avx(auVar72,auVar195,0x7f);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar216 + 1.0)),
                                          ZEXT416((uint)(fVar250 / fVar230)),auVar76);
                fVar255 = auVar75._0_4_ + auVar74._0_4_;
                auVar74 = vdpps_avx(local_790,auVar151,0x7f);
                auVar75 = vdpps_avx(auVar72,auVar80,0x7f);
                auVar76 = vmulss_avx512f(auVar79,auVar77);
                auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar76._0_4_ *
                                                               auVar77._0_4_ * auVar77._0_4_)));
                auVar76 = vdpps_avx(auVar72,local_790,0x7f);
                auVar77 = vfnmadd231ss_fma(auVar75,auVar73,ZEXT416((uint)fVar255));
                auVar76 = vfnmadd231ss_fma(auVar76,auVar73,auVar74);
                auVar75 = vpermilps_avx(local_5e0._0_16_,0xff);
                fVar231 = fVar231 - auVar75._0_4_;
                auVar80 = vshufps_avx(auVar1,auVar1,0xff);
                auVar75 = vfmsub213ss_fma(auVar77,auVar78,auVar80);
                auVar251._8_4_ = 0x80000000;
                auVar251._0_8_ = 0x8000000080000000;
                auVar251._12_4_ = 0x80000000;
                auVar253 = ZEXT1664(auVar251);
                auVar246._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                auVar246._8_4_ = auVar75._8_4_ ^ 0x80000000;
                auVar246._12_4_ = auVar75._12_4_ ^ 0x80000000;
                auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar78._0_4_));
                auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                          ZEXT416((uint)fVar255),auVar76);
                auVar75 = vinsertps_avx(auVar246,auVar76,0x1c);
                auVar241._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar74._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar74._12_4_ ^ 0x80000000;
                auVar76 = vinsertps_avx(ZEXT416((uint)fVar255),auVar241,0x10);
                auVar219._0_4_ = auVar77._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar74 = vdivps_avx(auVar75,auVar219);
                auVar75 = vdivps_avx(auVar76,auVar219);
                auVar220._0_4_ = fVar256 * auVar74._0_4_ + fVar231 * auVar75._0_4_;
                auVar220._4_4_ = fVar256 * auVar74._4_4_ + fVar231 * auVar75._4_4_;
                auVar220._8_4_ = fVar256 * auVar74._8_4_ + fVar231 * auVar75._8_4_;
                auVar220._12_4_ = fVar256 * auVar74._12_4_ + fVar231 * auVar75._12_4_;
                auVar74 = vsubps_avx(auVar82,auVar220);
                auVar258 = ZEXT1664(auVar74);
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(auVar73,auVar21);
                if (auVar75._0_4_ < auVar81._0_4_) {
                  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar232._0_4_)),
                                            local_6a0,ZEXT416(0x36000000));
                  auVar22._8_4_ = 0x7fffffff;
                  auVar22._0_8_ = 0x7fffffff7fffffff;
                  auVar22._12_4_ = 0x7fffffff;
                  auVar76 = vandps_avx512vl(ZEXT416((uint)fVar231),auVar22);
                  if (auVar76._0_4_ < auVar75._0_4_) {
                    fVar254 = auVar74._0_4_ + (float)local_6b0._0_4_;
                    auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar254 < fVar148) {
LAB_01d74cc2:
                      bVar58 = 0;
                      goto LAB_01d74cec;
                    }
                    fVar255 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar254 <= fVar255) {
                      auVar75 = vmovshdup_avx(auVar74);
                      bVar58 = 0;
                      if ((auVar75._0_4_ < 0.0) || (1.0 < auVar75._0_4_)) goto LAB_01d74cec;
                      auVar221._0_12_ = ZEXT812(0);
                      auVar221._12_4_ = 0;
                      auVar196._4_8_ = auVar221._4_8_;
                      auVar196._0_4_ = local_7c0._0_4_;
                      auVar196._12_4_ = 0;
                      auVar75 = vrsqrt14ss_avx512f(auVar221,auVar196);
                      fVar256 = auVar75._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01d74cc2;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01d74cec;
                      fVar256 = fVar256 * 1.5 + local_7c0._0_4_ * -0.5 * fVar256 * fVar256 * fVar256
                      ;
                      auVar197._0_4_ = auVar72._0_4_ * fVar256;
                      auVar197._4_4_ = auVar72._4_4_ * fVar256;
                      auVar197._8_4_ = auVar72._8_4_ * fVar256;
                      auVar197._12_4_ = auVar72._12_4_ * fVar256;
                      auVar73 = vfmadd213ps_fma(auVar80,auVar197,auVar1);
                      auVar75 = vshufps_avx(auVar197,auVar197,0xc9);
                      auVar72 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar198._0_4_ = auVar197._0_4_ * auVar72._0_4_;
                      auVar198._4_4_ = auVar197._4_4_ * auVar72._4_4_;
                      auVar198._8_4_ = auVar197._8_4_ * auVar72._8_4_;
                      auVar198._12_4_ = auVar197._12_4_ * auVar72._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar198,auVar1,auVar75);
                      auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                      auVar153._0_4_ = auVar73._0_4_ * auVar76._0_4_;
                      auVar153._4_4_ = auVar73._4_4_ * auVar76._4_4_;
                      auVar153._8_4_ = auVar73._8_4_ * auVar76._8_4_;
                      auVar153._12_4_ = auVar73._12_4_ * auVar76._12_4_;
                      auVar75 = vfmsub231ps_fma(auVar153,auVar75,auVar72);
                      auVar228._8_4_ = 1;
                      auVar228._0_8_ = 0x100000001;
                      auVar228._12_4_ = 1;
                      auVar228._16_4_ = 1;
                      auVar228._20_4_ = 1;
                      auVar228._24_4_ = 1;
                      auVar228._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar228,ZEXT1632(auVar74));
                      auVar83 = vpermps_avx2(auVar228,ZEXT1632(auVar75));
                      auVar238._8_4_ = 2;
                      auVar238._0_8_ = 0x200000002;
                      auVar238._12_4_ = 2;
                      auVar238._16_4_ = 2;
                      auVar238._20_4_ = 2;
                      auVar238._24_4_ = 2;
                      auVar238._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar238,ZEXT1632(auVar75));
                      local_440 = auVar75._0_4_;
                      local_480[0] = (RTCHitN)auVar83[0];
                      local_480[1] = (RTCHitN)auVar83[1];
                      local_480[2] = (RTCHitN)auVar83[2];
                      local_480[3] = (RTCHitN)auVar83[3];
                      local_480[4] = (RTCHitN)auVar83[4];
                      local_480[5] = (RTCHitN)auVar83[5];
                      local_480[6] = (RTCHitN)auVar83[6];
                      local_480[7] = (RTCHitN)auVar83[7];
                      local_480[8] = (RTCHitN)auVar83[8];
                      local_480[9] = (RTCHitN)auVar83[9];
                      local_480[10] = (RTCHitN)auVar83[10];
                      local_480[0xb] = (RTCHitN)auVar83[0xb];
                      local_480[0xc] = (RTCHitN)auVar83[0xc];
                      local_480[0xd] = (RTCHitN)auVar83[0xd];
                      local_480[0xe] = (RTCHitN)auVar83[0xe];
                      local_480[0xf] = (RTCHitN)auVar83[0xf];
                      local_480[0x10] = (RTCHitN)auVar83[0x10];
                      local_480[0x11] = (RTCHitN)auVar83[0x11];
                      local_480[0x12] = (RTCHitN)auVar83[0x12];
                      local_480[0x13] = (RTCHitN)auVar83[0x13];
                      local_480[0x14] = (RTCHitN)auVar83[0x14];
                      local_480[0x15] = (RTCHitN)auVar83[0x15];
                      local_480[0x16] = (RTCHitN)auVar83[0x16];
                      local_480[0x17] = (RTCHitN)auVar83[0x17];
                      local_480[0x18] = (RTCHitN)auVar83[0x18];
                      local_480[0x19] = (RTCHitN)auVar83[0x19];
                      local_480[0x1a] = (RTCHitN)auVar83[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar83[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar83[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar83[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar83[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar83[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar254;
                      local_6e0 = local_500;
                      local_810.valid = (int *)local_6e0;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_480;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar253 = ZEXT1664(auVar251);
                        auVar258 = ZEXT1664(auVar74);
                        auVar262 = ZEXT1664(local_7c0._0_16_);
                        auVar265 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_810);
                        auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      if (local_6e0 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          auVar258 = ZEXT1664(auVar258._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          auVar265 = ZEXT1664(auVar265._0_16_);
                          (*p_Var4)(&local_810);
                          auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        }
                        uVar69 = vptestmd_avx512vl(local_6e0,local_6e0);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar69 & 1);
                        bVar6 = (bool)((byte)(uVar69 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar69 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar69 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar69 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar69 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar69 >> 6) & 1);
                        bVar12 = SUB81(uVar69 >> 7,0);
                        *(uint *)(local_810.ray + 0x100) =
                             (uint)bVar5 * auVar83._0_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x100);
                        *(uint *)(local_810.ray + 0x104) =
                             (uint)bVar6 * auVar83._4_4_ |
                             (uint)!bVar6 * *(int *)(local_810.ray + 0x104);
                        *(uint *)(local_810.ray + 0x108) =
                             (uint)bVar7 * auVar83._8_4_ |
                             (uint)!bVar7 * *(int *)(local_810.ray + 0x108);
                        *(uint *)(local_810.ray + 0x10c) =
                             (uint)bVar8 * auVar83._12_4_ |
                             (uint)!bVar8 * *(int *)(local_810.ray + 0x10c);
                        *(uint *)(local_810.ray + 0x110) =
                             (uint)bVar9 * auVar83._16_4_ |
                             (uint)!bVar9 * *(int *)(local_810.ray + 0x110);
                        *(uint *)(local_810.ray + 0x114) =
                             (uint)bVar10 * auVar83._20_4_ |
                             (uint)!bVar10 * *(int *)(local_810.ray + 0x114);
                        *(uint *)(local_810.ray + 0x118) =
                             (uint)bVar11 * auVar83._24_4_ |
                             (uint)!bVar11 * *(int *)(local_810.ray + 0x118);
                        *(uint *)(local_810.ray + 0x11c) =
                             (uint)bVar12 * auVar83._28_4_ |
                             (uint)!bVar12 * *(int *)(local_810.ray + 0x11c);
                        bVar58 = 1;
                        if (local_6e0 != (undefined1  [32])0x0) goto LAB_01d74cec;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar255;
                    }
                    bVar58 = 0;
                    goto LAB_01d74cec;
                  }
                }
                bVar68 = uVar69 < 4;
                uVar69 = uVar69 + 1;
              } while (uVar69 != 5);
              bVar68 = false;
              auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar58 = 5;
LAB_01d74cec:
              bVar65 = (bool)(bVar65 | bVar68 & bVar58);
              uVar171 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar162._4_4_ = uVar171;
              auVar162._0_4_ = uVar171;
              auVar162._8_4_ = uVar171;
              auVar162._12_4_ = uVar171;
              auVar162._16_4_ = uVar171;
              auVar162._20_4_ = uVar171;
              auVar162._24_4_ = uVar171;
              auVar162._28_4_ = uVar171;
              auVar52._4_4_ = fStack_53c;
              auVar52._0_4_ = local_540;
              auVar52._8_4_ = fStack_538;
              auVar52._12_4_ = fStack_534;
              auVar52._16_4_ = fStack_530;
              auVar52._20_4_ = fStack_52c;
              auVar52._24_4_ = fStack_528;
              auVar52._28_4_ = fStack_524;
              uVar16 = vcmpps_avx512vl(auVar162,auVar52,0xd);
              bVar66 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar66 & (byte)uVar16;
              auVar83 = local_320;
            } while (bVar66 != 0);
          }
          auVar249 = ZEXT3264(local_360);
          bVar63 = local_560[0] | ~bVar63;
          auVar185._0_4_ = fVar164 + auVar83._0_4_;
          auVar185._4_4_ = fVar164 + auVar83._4_4_;
          auVar185._8_4_ = fVar164 + auVar83._8_4_;
          auVar185._12_4_ = fVar164 + auVar83._12_4_;
          auVar185._16_4_ = fVar164 + auVar83._16_4_;
          auVar185._20_4_ = fVar164 + auVar83._20_4_;
          auVar185._24_4_ = fVar164 + auVar83._24_4_;
          auVar185._28_4_ = fVar164 + auVar83._28_4_;
          uVar16 = vcmpps_avx512vl(auVar185,auVar162,2);
          bVar56 = (byte)uVar17 & bVar56 & (byte)uVar16;
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar83 = vpblendmd_avx512vl(auVar186,auVar29);
          auVar137._0_4_ = (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
          bVar68 = (bool)(bVar63 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar63 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar63 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar63 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar63 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * 2;
          bVar68 = (bool)(bVar63 >> 6 & 1);
          auVar137._24_4_ = (uint)bVar68 * auVar83._24_4_ | (uint)!bVar68 * 2;
          auVar137._28_4_ = (uint)(bVar63 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
          uVar16 = vpcmpd_avx512vl(local_4e0,auVar137,5);
          bVar63 = (byte)uVar16 & bVar56;
          if (bVar63 != 0) {
            auVar75 = vminps_avx(local_720._0_16_,local_760._0_16_);
            auVar74 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
            auVar72 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar1 = vminps_avx(auVar75,auVar72);
            auVar75 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar72 = vmaxps_avx(auVar74,auVar75);
            auVar199._8_4_ = 0x7fffffff;
            auVar199._0_8_ = 0x7fffffff7fffffff;
            auVar199._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx(auVar1,auVar199);
            auVar75 = vandps_avx(auVar72,auVar199);
            auVar74 = vmaxps_avx(auVar74,auVar75);
            auVar75 = vmovshdup_avx(auVar74);
            auVar75 = vmaxss_avx(auVar75,auVar74);
            auVar74 = vshufpd_avx(auVar74,auVar74,1);
            auVar74 = vmaxss_avx(auVar74,auVar75);
            fVar250 = auVar74._0_4_ * 1.9073486e-06;
            local_6a0 = vshufps_avx(auVar72,auVar72,0xff);
            local_540 = fVar164 + local_360._0_4_;
            fStack_53c = fVar164 + local_360._4_4_;
            fStack_538 = fVar164 + local_360._8_4_;
            fStack_534 = fVar164 + local_360._12_4_;
            fStack_530 = fVar164 + local_360._16_4_;
            fStack_52c = fVar164 + local_360._20_4_;
            fStack_528 = fVar164 + local_360._24_4_;
            fStack_524 = fVar164 + local_360._28_4_;
            _local_7e0 = local_360;
            local_560 = auVar137;
            do {
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar83 = vblendmps_avx512vl(auVar163,auVar249._0_32_);
              auVar138._0_4_ =
                   (uint)(bVar63 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
              bVar68 = (bool)(bVar63 >> 1 & 1);
              auVar138._4_4_ = (uint)bVar68 * auVar83._4_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar63 >> 2 & 1);
              auVar138._8_4_ = (uint)bVar68 * auVar83._8_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar63 >> 3 & 1);
              auVar138._12_4_ = (uint)bVar68 * auVar83._12_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar63 >> 4 & 1);
              auVar138._16_4_ = (uint)bVar68 * auVar83._16_4_ | (uint)!bVar68 * 0x7f800000;
              bVar68 = (bool)(bVar63 >> 5 & 1);
              auVar138._20_4_ = (uint)bVar68 * auVar83._20_4_ | (uint)!bVar68 * 0x7f800000;
              auVar138._24_4_ =
                   (uint)(bVar63 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar83 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar83 = vminps_avx(auVar138,auVar83);
              auVar84 = vshufpd_avx(auVar83,auVar83,5);
              auVar83 = vminps_avx(auVar83,auVar84);
              auVar84 = vpermpd_avx2(auVar83,0x4e);
              auVar83 = vminps_avx(auVar83,auVar84);
              uVar16 = vcmpps_avx512vl(auVar138,auVar83,0);
              bVar58 = (byte)uVar16 & bVar63;
              bVar66 = bVar63;
              if (bVar58 != 0) {
                bVar66 = bVar58;
              }
              iVar19 = 0;
              for (uVar71 = (uint)bVar66; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar71 = *(uint *)(local_200 + (uint)(iVar19 << 2));
              uVar70 = *(uint *)(local_340 + (uint)(iVar19 << 2));
              fVar254 = auVar13._0_4_;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar254 = sqrtf((float)local_7a0._0_4_);
              }
              auVar74 = vinsertps_avx(ZEXT416(uVar70),ZEXT416(uVar71),0x10);
              auVar258 = ZEXT1664(auVar74);
              bVar68 = true;
              uVar69 = 0;
              do {
                uVar171 = auVar258._0_4_;
                auVar154._4_4_ = uVar171;
                auVar154._0_4_ = uVar171;
                auVar154._8_4_ = uVar171;
                auVar154._12_4_ = uVar171;
                auVar74 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_790);
                local_700 = auVar258._0_32_;
                auVar75 = vmovshdup_avx(auVar258._0_16_);
                fVar240 = auVar75._0_4_;
                fVar267 = 1.0 - fVar240;
                fVar256 = fVar267 * fVar267 * fVar267;
                fVar216 = fVar240 * fVar240 * fVar240;
                auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar256),
                                          ZEXT416((uint)fVar216));
                fVar255 = fVar240 * fVar267;
                auVar232 = ZEXT416((uint)fVar267);
                auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * fVar240 * 6.0)),
                                          ZEXT416((uint)(fVar255 * fVar267)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                         ZEXT416((uint)fVar256));
                auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * fVar267 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar255 * fVar240)));
                fVar256 = fVar256 * 0.16666667;
                fVar230 = (auVar72._0_4_ + auVar76._0_4_) * 0.16666667;
                fVar231 = (auVar1._0_4_ + auVar73._0_4_) * 0.16666667;
                fVar216 = fVar216 * 0.16666667;
                auVar200._0_4_ = fVar216 * (float)local_780._0_4_;
                auVar200._4_4_ = fVar216 * (float)local_780._4_4_;
                auVar200._8_4_ = fVar216 * fStack_778;
                auVar200._12_4_ = fVar216 * fStack_774;
                auVar234._4_4_ = fVar231;
                auVar234._0_4_ = fVar231;
                auVar234._8_4_ = fVar231;
                auVar234._12_4_ = fVar231;
                auVar72 = vfmadd132ps_fma(auVar234,auVar200,local_740._0_16_);
                auVar201._4_4_ = fVar230;
                auVar201._0_4_ = fVar230;
                auVar201._8_4_ = fVar230;
                auVar201._12_4_ = fVar230;
                auVar72 = vfmadd132ps_fma(auVar201,auVar72,local_760._0_16_);
                auVar178._4_4_ = fVar256;
                auVar178._0_4_ = fVar256;
                auVar178._8_4_ = fVar256;
                auVar178._12_4_ = fVar256;
                auVar72 = vfmadd132ps_fma(auVar178,auVar72,local_720._0_16_);
                local_5e0._0_16_ = auVar72;
                auVar72 = vsubps_avx(auVar74,auVar72);
                auVar74 = vdpps_avx(auVar72,auVar72,0x7f);
                local_7c0._0_16_ = auVar74;
                if (auVar74._0_4_ < 0.0) {
                  auVar253._0_4_ = sqrtf(auVar74._0_4_);
                  auVar253._4_60_ = extraout_var_00;
                  auVar74 = auVar253._0_16_;
                }
                else {
                  auVar74 = vsqrtss_avx(auVar74,auVar74);
                }
                local_600._4_4_ = fVar267;
                local_600._0_4_ = fVar267;
                fStack_5f8 = fVar267;
                fStack_5f4 = fVar267;
                auVar76 = vfnmsub213ss_fma(auVar75,auVar75,ZEXT416((uint)(fVar255 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * 4.0)),auVar232,auVar232);
                fVar255 = fVar267 * -fVar267 * 0.5;
                fVar256 = auVar76._0_4_ * 0.5;
                fVar230 = auVar1._0_4_ * 0.5;
                fVar231 = fVar240 * fVar240 * 0.5;
                auVar222._0_4_ = fVar231 * (float)local_780._0_4_;
                auVar222._4_4_ = fVar231 * (float)local_780._4_4_;
                auVar222._8_4_ = fVar231 * fStack_778;
                auVar222._12_4_ = fVar231 * fStack_774;
                auVar179._4_4_ = fVar230;
                auVar179._0_4_ = fVar230;
                auVar179._8_4_ = fVar230;
                auVar179._12_4_ = fVar230;
                auVar1 = vfmadd132ps_fma(auVar179,auVar222,local_740._0_16_);
                auVar202._4_4_ = fVar256;
                auVar202._0_4_ = fVar256;
                auVar202._8_4_ = fVar256;
                auVar202._12_4_ = fVar256;
                auVar1 = vfmadd132ps_fma(auVar202,auVar1,local_760._0_16_);
                auVar264._4_4_ = fVar255;
                auVar264._0_4_ = fVar255;
                auVar264._8_4_ = fVar255;
                auVar264._12_4_ = fVar255;
                auVar1 = vfmadd132ps_fma(auVar264,auVar1,local_720._0_16_);
                local_620._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
                auVar51._12_4_ = 0;
                auVar51._0_12_ = ZEXT812(0);
                fVar255 = local_620._0_4_;
                auVar76 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar255));
                fVar256 = auVar76._0_4_;
                local_640._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar255));
                auVar76 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                uVar71 = auVar74._0_4_;
                if (fVar255 < -fVar255) {
                  fVar230 = sqrtf(fVar255);
                  auVar74 = ZEXT416(uVar71);
                }
                else {
                  auVar73 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                  fVar230 = auVar73._0_4_;
                }
                auVar79 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(fVar256 * 1.5 +
                                                   fVar255 * -0.5 * fVar256 * fVar256 * fVar256)));
                auVar78 = vmulps_avx512vl(auVar1,auVar79);
                auVar73 = vdpps_avx(auVar72,auVar78,0x7f);
                fVar231 = auVar74._0_4_;
                fVar255 = auVar73._0_4_;
                auVar155._0_4_ = fVar255 * fVar255;
                auVar155._4_4_ = auVar73._4_4_ * auVar73._4_4_;
                auVar155._8_4_ = auVar73._8_4_ * auVar73._8_4_;
                auVar155._12_4_ = auVar73._12_4_ * auVar73._12_4_;
                auVar80 = vsubps_avx(local_7c0._0_16_,auVar155);
                fVar256 = auVar80._0_4_;
                auVar180._4_12_ = ZEXT812(0) << 0x20;
                auVar180._0_4_ = fVar256;
                auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
                auVar81 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
                auVar82 = vmulss_avx512f(auVar80,ZEXT416(0xbf000000));
                if (fVar256 < 0.0) {
                  local_670._0_4_ = auVar81._0_4_;
                  _local_690 = auVar79;
                  local_680 = auVar78;
                  local_660 = auVar77;
                  fVar256 = sqrtf(fVar256);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar81 = ZEXT416((uint)local_670._0_4_);
                  auVar74 = ZEXT416(uVar71);
                  auVar77 = local_660;
                  auVar78 = local_680;
                  auVar79 = _local_690;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar256 = auVar80._0_4_;
                }
                auVar265 = ZEXT1664(auVar1);
                auVar262 = ZEXT1664(local_7c0._0_16_);
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar232,auVar75);
                auVar232 = vfmadd213ss_fma(auVar75,SUB6416(ZEXT464(0xc0000000),0),auVar232);
                auVar257 = local_700._0_16_;
                auVar75 = vshufps_avx(auVar257,auVar257,0x55);
                auVar203._0_4_ = auVar75._0_4_ * (float)local_780._0_4_;
                auVar203._4_4_ = auVar75._4_4_ * (float)local_780._4_4_;
                auVar203._8_4_ = auVar75._8_4_ * fStack_778;
                auVar203._12_4_ = auVar75._12_4_ * fStack_774;
                auVar223._0_4_ = auVar232._0_4_;
                auVar223._4_4_ = auVar223._0_4_;
                auVar223._8_4_ = auVar223._0_4_;
                auVar223._12_4_ = auVar223._0_4_;
                auVar75 = vfmadd132ps_fma(auVar223,auVar203,local_740._0_16_);
                auVar181._0_4_ = auVar80._0_4_;
                auVar181._4_4_ = auVar181._0_4_;
                auVar181._8_4_ = auVar181._0_4_;
                auVar181._12_4_ = auVar181._0_4_;
                auVar75 = vfmadd132ps_fma(auVar181,auVar75,local_760._0_16_);
                auVar75 = vfmadd132ps_fma(_local_600,auVar75,local_720._0_16_);
                auVar182._0_4_ = auVar75._0_4_ * (float)local_620._0_4_;
                auVar182._4_4_ = auVar75._4_4_ * (float)local_620._0_4_;
                auVar182._8_4_ = auVar75._8_4_ * (float)local_620._0_4_;
                auVar182._12_4_ = auVar75._12_4_ * (float)local_620._0_4_;
                auVar75 = vdpps_avx(auVar1,auVar75,0x7f);
                fVar216 = auVar75._0_4_;
                auVar204._0_4_ = auVar1._0_4_ * fVar216;
                auVar204._4_4_ = auVar1._4_4_ * fVar216;
                auVar204._8_4_ = auVar1._8_4_ * fVar216;
                auVar204._12_4_ = auVar1._12_4_ * fVar216;
                auVar75 = vsubps_avx(auVar182,auVar204);
                fVar216 = auVar76._0_4_ * (float)local_640._0_4_;
                auVar232 = vmaxss_avx(ZEXT416((uint)fVar250),
                                      ZEXT416((uint)(local_700._0_4_ * fVar254 * 1.9073486e-06)));
                auVar205._0_4_ = auVar75._0_4_ * fVar216;
                auVar205._4_4_ = auVar75._4_4_ * fVar216;
                auVar205._8_4_ = auVar75._8_4_ * fVar216;
                auVar205._12_4_ = auVar75._12_4_ * fVar216;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar1,auVar23);
                auVar79 = vmulps_avx512vl(auVar79,auVar205);
                auVar75 = vdpps_avx(auVar80,auVar78,0x7f);
                auVar76 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar250),auVar232);
                auVar74 = vdpps_avx(auVar72,auVar79,0x7f);
                auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar231 + 1.0)),
                                          ZEXT416((uint)(fVar250 / fVar230)),auVar76);
                fVar230 = auVar75._0_4_ + auVar74._0_4_;
                auVar74 = vdpps_avx(local_790,auVar78,0x7f);
                auVar75 = vdpps_avx(auVar72,auVar80,0x7f);
                auVar76 = vmulss_avx512f(auVar82,auVar77);
                auVar78 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar76._0_4_ *
                                                               auVar77._0_4_ * auVar77._0_4_)));
                auVar76 = vdpps_avx(auVar72,local_790,0x7f);
                auVar77 = vfnmadd231ss_fma(auVar75,auVar73,ZEXT416((uint)fVar230));
                auVar76 = vfnmadd231ss_fma(auVar76,auVar73,auVar74);
                auVar75 = vpermilps_avx(local_5e0._0_16_,0xff);
                fVar256 = fVar256 - auVar75._0_4_;
                auVar80 = vshufps_avx(auVar1,auVar1,0xff);
                auVar75 = vfmsub213ss_fma(auVar77,auVar78,auVar80);
                auVar253 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                auVar247._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = auVar75._8_4_ ^ 0x80000000;
                auVar247._12_4_ = auVar75._12_4_ ^ 0x80000000;
                auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar78._0_4_));
                auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                          ZEXT416((uint)fVar230),auVar76);
                auVar75 = vinsertps_avx(auVar247,auVar76,0x1c);
                auVar242._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar74._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar74._12_4_ ^ 0x80000000;
                auVar76 = vinsertps_avx(ZEXT416((uint)fVar230),auVar242,0x10);
                auVar224._0_4_ = auVar77._0_4_;
                auVar224._4_4_ = auVar224._0_4_;
                auVar224._8_4_ = auVar224._0_4_;
                auVar224._12_4_ = auVar224._0_4_;
                auVar74 = vdivps_avx(auVar75,auVar224);
                auVar75 = vdivps_avx(auVar76,auVar224);
                auVar225._0_4_ = fVar255 * auVar74._0_4_ + fVar256 * auVar75._0_4_;
                auVar225._4_4_ = fVar255 * auVar74._4_4_ + fVar256 * auVar75._4_4_;
                auVar225._8_4_ = fVar255 * auVar74._8_4_ + fVar256 * auVar75._8_4_;
                auVar225._12_4_ = fVar255 * auVar74._12_4_ + fVar256 * auVar75._12_4_;
                auVar74 = vsubps_avx(auVar257,auVar225);
                auVar258 = ZEXT1664(auVar74);
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(auVar73,auVar24);
                if (auVar75._0_4_ < auVar79._0_4_) {
                  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ + auVar232._0_4_)),
                                            local_6a0,ZEXT416(0x36000000));
                  auVar25._8_4_ = 0x7fffffff;
                  auVar25._0_8_ = 0x7fffffff7fffffff;
                  auVar25._12_4_ = 0x7fffffff;
                  auVar76 = vandps_avx512vl(ZEXT416((uint)fVar256),auVar25);
                  if (auVar76._0_4_ < auVar75._0_4_) {
                    fVar254 = auVar74._0_4_ + (float)local_6b0._0_4_;
                    auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar254 < fVar148) {
                      bVar66 = 0;
                      goto LAB_01d75975;
                    }
                    fVar255 = *(float *)(ray + k * 4 + 0x100);
                    auVar253 = ZEXT464((uint)fVar255);
                    auVar249 = ZEXT3264(_local_7e0);
                    if (fVar254 <= fVar255) {
                      auVar75 = vmovshdup_avx(auVar74);
                      bVar66 = 0;
                      if ((auVar75._0_4_ < 0.0) || (1.0 < auVar75._0_4_)) goto LAB_01d7597e;
                      auVar226._0_12_ = ZEXT812(0);
                      auVar226._12_4_ = 0;
                      auVar206._4_8_ = auVar226._4_8_;
                      auVar206._0_4_ = local_7c0._0_4_;
                      auVar206._12_4_ = 0;
                      auVar75 = vrsqrt14ss_avx512f(auVar226,auVar206);
                      fVar256 = auVar75._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar66 = 0;
                        goto LAB_01d7597e;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar66 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01d7597e;
                      fVar256 = fVar256 * 1.5 + local_7c0._0_4_ * -0.5 * fVar256 * fVar256 * fVar256
                      ;
                      auVar207._0_4_ = auVar72._0_4_ * fVar256;
                      auVar207._4_4_ = auVar72._4_4_ * fVar256;
                      auVar207._8_4_ = auVar72._8_4_ * fVar256;
                      auVar207._12_4_ = auVar72._12_4_ * fVar256;
                      auVar73 = vfmadd213ps_fma(auVar80,auVar207,auVar1);
                      auVar75 = vshufps_avx(auVar207,auVar207,0xc9);
                      auVar72 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar208._0_4_ = auVar207._0_4_ * auVar72._0_4_;
                      auVar208._4_4_ = auVar207._4_4_ * auVar72._4_4_;
                      auVar208._8_4_ = auVar207._8_4_ * auVar72._8_4_;
                      auVar208._12_4_ = auVar207._12_4_ * auVar72._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar208,auVar1,auVar75);
                      auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                      auVar156._0_4_ = auVar73._0_4_ * auVar76._0_4_;
                      auVar156._4_4_ = auVar73._4_4_ * auVar76._4_4_;
                      auVar156._8_4_ = auVar73._8_4_ * auVar76._8_4_;
                      auVar156._12_4_ = auVar73._12_4_ * auVar76._12_4_;
                      auVar75 = vfmsub231ps_fma(auVar156,auVar75,auVar72);
                      auVar229._8_4_ = 1;
                      auVar229._0_8_ = 0x100000001;
                      auVar229._12_4_ = 1;
                      auVar229._16_4_ = 1;
                      auVar229._20_4_ = 1;
                      auVar229._24_4_ = 1;
                      auVar229._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar229,ZEXT1632(auVar74));
                      auVar83 = vpermps_avx2(auVar229,ZEXT1632(auVar75));
                      auVar239._8_4_ = 2;
                      auVar239._0_8_ = 0x200000002;
                      auVar239._12_4_ = 2;
                      auVar239._16_4_ = 2;
                      auVar239._20_4_ = 2;
                      auVar239._24_4_ = 2;
                      auVar239._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar239,ZEXT1632(auVar75));
                      local_440 = auVar75._0_4_;
                      local_480[0] = (RTCHitN)auVar83[0];
                      local_480[1] = (RTCHitN)auVar83[1];
                      local_480[2] = (RTCHitN)auVar83[2];
                      local_480[3] = (RTCHitN)auVar83[3];
                      local_480[4] = (RTCHitN)auVar83[4];
                      local_480[5] = (RTCHitN)auVar83[5];
                      local_480[6] = (RTCHitN)auVar83[6];
                      local_480[7] = (RTCHitN)auVar83[7];
                      local_480[8] = (RTCHitN)auVar83[8];
                      local_480[9] = (RTCHitN)auVar83[9];
                      local_480[10] = (RTCHitN)auVar83[10];
                      local_480[0xb] = (RTCHitN)auVar83[0xb];
                      local_480[0xc] = (RTCHitN)auVar83[0xc];
                      local_480[0xd] = (RTCHitN)auVar83[0xd];
                      local_480[0xe] = (RTCHitN)auVar83[0xe];
                      local_480[0xf] = (RTCHitN)auVar83[0xf];
                      local_480[0x10] = (RTCHitN)auVar83[0x10];
                      local_480[0x11] = (RTCHitN)auVar83[0x11];
                      local_480[0x12] = (RTCHitN)auVar83[0x12];
                      local_480[0x13] = (RTCHitN)auVar83[0x13];
                      local_480[0x14] = (RTCHitN)auVar83[0x14];
                      local_480[0x15] = (RTCHitN)auVar83[0x15];
                      local_480[0x16] = (RTCHitN)auVar83[0x16];
                      local_480[0x17] = (RTCHitN)auVar83[0x17];
                      local_480[0x18] = (RTCHitN)auVar83[0x18];
                      local_480[0x19] = (RTCHitN)auVar83[0x19];
                      local_480[0x1a] = (RTCHitN)auVar83[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar83[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar83[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar83[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar83[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar83[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar254;
                      local_6e0 = local_500;
                      local_810.valid = (int *)local_6e0;
                      local_810.geometryUserPtr = pGVar3->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_480;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar258 = ZEXT1664(auVar74);
                        auVar262 = ZEXT1664(local_7c0._0_16_);
                        auVar265 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_810);
                        auVar249 = ZEXT3264(_local_7e0);
                        auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      if (local_6e0 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar258 = ZEXT1664(auVar258._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          auVar265 = ZEXT1664(auVar265._0_16_);
                          (*p_Var4)(&local_810);
                          auVar249 = ZEXT3264(_local_7e0);
                          auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        }
                        auVar253 = ZEXT464((uint)fVar255);
                        uVar69 = vptestmd_avx512vl(local_6e0,local_6e0);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar69 & 1);
                        auVar139._0_4_ =
                             (uint)bVar5 * auVar83._0_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x100);
                        bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
                        auVar139._4_4_ =
                             (uint)bVar5 * auVar83._4_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x104);
                        bVar5 = (bool)((byte)(uVar69 >> 2) & 1);
                        auVar139._8_4_ =
                             (uint)bVar5 * auVar83._8_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x108);
                        bVar5 = (bool)((byte)(uVar69 >> 3) & 1);
                        auVar139._12_4_ =
                             (uint)bVar5 * auVar83._12_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x10c);
                        bVar5 = (bool)((byte)(uVar69 >> 4) & 1);
                        auVar139._16_4_ =
                             (uint)bVar5 * auVar83._16_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x110);
                        bVar5 = (bool)((byte)(uVar69 >> 5) & 1);
                        auVar139._20_4_ =
                             (uint)bVar5 * auVar83._20_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x114);
                        bVar5 = (bool)((byte)(uVar69 >> 6) & 1);
                        auVar139._24_4_ =
                             (uint)bVar5 * auVar83._24_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x118);
                        bVar5 = SUB81(uVar69 >> 7,0);
                        auVar139._28_4_ =
                             (uint)bVar5 * auVar83._28_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x11c);
                        *(undefined1 (*) [32])(local_810.ray + 0x100) = auVar139;
                        bVar66 = 1;
                        if (local_6e0 != (undefined1  [32])0x0) goto LAB_01d7597e;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar255;
                    }
                    auVar253 = ZEXT464((uint)fVar255);
                    bVar66 = 0;
                    goto LAB_01d7597e;
                  }
                }
                bVar68 = uVar69 < 4;
                uVar69 = uVar69 + 1;
              } while (uVar69 != 5);
              bVar68 = false;
              auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar66 = 5;
LAB_01d75975:
              auVar249 = ZEXT3264(_local_7e0);
LAB_01d7597e:
              bVar65 = (bool)(bVar65 | bVar68 & bVar66);
              uVar171 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar162._4_4_ = uVar171;
              auVar162._0_4_ = uVar171;
              auVar162._8_4_ = uVar171;
              auVar162._12_4_ = uVar171;
              auVar162._16_4_ = uVar171;
              auVar162._20_4_ = uVar171;
              auVar162._24_4_ = uVar171;
              auVar162._28_4_ = uVar171;
              auVar53._4_4_ = fStack_53c;
              auVar53._0_4_ = local_540;
              auVar53._8_4_ = fStack_538;
              auVar53._12_4_ = fStack_534;
              auVar53._16_4_ = fStack_530;
              auVar53._20_4_ = fStack_52c;
              auVar53._24_4_ = fStack_528;
              auVar53._28_4_ = fStack_524;
              uVar16 = vcmpps_avx512vl(auVar162,auVar53,0xd);
              bVar63 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar63 & (byte)uVar16;
            } while (bVar63 != 0);
            auVar249 = ZEXT3264(local_360);
            auVar137 = local_560;
          }
          uVar17 = vpcmpgtd_avx512vl(auVar137,local_4e0);
          uVar18 = vpcmpd_avx512vl(local_4e0,local_300,1);
          auVar211._0_4_ = fVar164 + (float)local_1c0._0_4_;
          auVar211._4_4_ = fVar164 + (float)local_1c0._4_4_;
          auVar211._8_4_ = fVar164 + fStack_1b8;
          auVar211._12_4_ = fVar164 + fStack_1b4;
          auVar211._16_4_ = fVar164 + fStack_1b0;
          auVar211._20_4_ = fVar164 + fStack_1ac;
          auVar211._24_4_ = fVar164 + fStack_1a8;
          auVar211._28_4_ = fVar164 + fStack_1a4;
          uVar16 = vcmpps_avx512vl(auVar211,auVar162,2);
          bVar59 = bVar59 & (byte)uVar18 & (byte)uVar16;
          auVar212._0_4_ = fVar164 + auVar249._0_4_;
          auVar212._4_4_ = fVar164 + auVar249._4_4_;
          auVar212._8_4_ = fVar164 + auVar249._8_4_;
          auVar212._12_4_ = fVar164 + auVar249._12_4_;
          auVar212._16_4_ = fVar164 + auVar249._16_4_;
          auVar212._20_4_ = fVar164 + auVar249._20_4_;
          auVar212._24_4_ = fVar164 + auVar249._24_4_;
          auVar212._28_4_ = fVar164 + auVar249._28_4_;
          uVar16 = vcmpps_avx512vl(auVar212,auVar162,2);
          bVar56 = bVar56 & (byte)uVar17 & (byte)uVar16 | bVar59;
          prim = local_650;
          if (bVar56 != 0) {
            uVar64 = (ulong)uVar62;
            abStack_180[uVar64 * 0x60] = bVar56;
            auVar140._0_4_ =
                 (uint)(bVar59 & 1) * local_1c0._0_4_ |
                 (uint)!(bool)(bVar59 & 1) * (int)auVar249._0_4_;
            bVar68 = (bool)(bVar59 >> 1 & 1);
            auVar140._4_4_ = (uint)bVar68 * local_1c0._4_4_ | (uint)!bVar68 * (int)auVar249._4_4_;
            bVar68 = (bool)(bVar59 >> 2 & 1);
            auVar140._8_4_ = (uint)bVar68 * (int)fStack_1b8 | (uint)!bVar68 * (int)auVar249._8_4_;
            bVar68 = (bool)(bVar59 >> 3 & 1);
            auVar140._12_4_ = (uint)bVar68 * (int)fStack_1b4 | (uint)!bVar68 * (int)auVar249._12_4_;
            bVar68 = (bool)(bVar59 >> 4 & 1);
            auVar140._16_4_ = (uint)bVar68 * (int)fStack_1b0 | (uint)!bVar68 * (int)auVar249._16_4_;
            bVar68 = (bool)(bVar59 >> 5 & 1);
            auVar140._20_4_ = (uint)bVar68 * (int)fStack_1ac | (uint)!bVar68 * (int)auVar249._20_4_;
            auVar140._24_4_ =
                 (uint)(bVar59 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar59 >> 6) * (int)auVar249._24_4_;
            auVar140._28_4_ = auVar249._28_4_;
            auVar249 = ZEXT3264(auVar140);
            *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x60) = auVar140;
            uVar69 = vmovlps_avx(local_510);
            (&uStack_140)[uVar64 * 0xc] = uVar69;
            aiStack_138[uVar64 * 0x18] = local_b18 + 1;
            uVar62 = uVar62 + 1;
          }
        }
      }
    }
    do {
      uVar71 = uVar62;
      uVar70 = uVar71 - 1;
      if (uVar71 == 0) {
        if (bVar65 != false) {
          return bVar65;
        }
        uVar171 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar171;
        auVar31._0_4_ = uVar171;
        auVar31._8_4_ = uVar171;
        auVar31._12_4_ = uVar171;
        auVar31._16_4_ = uVar171;
        auVar31._20_4_ = uVar171;
        auVar31._24_4_ = uVar171;
        auVar31._28_4_ = uVar171;
        uVar16 = vcmpps_avx512vl(local_2e0,auVar31,2);
        uVar67 = (uint)local_648 & (uint)uVar16;
        local_648 = (ulong)uVar67;
        if (uVar67 == 0) {
          return false;
        }
        goto LAB_01d73406;
      }
      uVar69 = (ulong)uVar70;
      lVar61 = uVar69 * 0x60;
      auVar83 = *(undefined1 (*) [32])(auStack_160 + lVar61);
      auVar183._0_4_ = fVar164 + auVar83._0_4_;
      auVar183._4_4_ = fVar164 + auVar83._4_4_;
      auVar183._8_4_ = fVar164 + auVar83._8_4_;
      auVar183._12_4_ = fVar164 + auVar83._12_4_;
      auVar183._16_4_ = fVar164 + auVar83._16_4_;
      auVar183._20_4_ = fVar164 + auVar83._20_4_;
      auVar183._24_4_ = fVar164 + auVar83._24_4_;
      auVar183._28_4_ = fVar164 + auVar83._28_4_;
      uVar171 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar171;
      auVar30._0_4_ = uVar171;
      auVar30._8_4_ = uVar171;
      auVar30._12_4_ = uVar171;
      auVar30._16_4_ = uVar171;
      auVar30._20_4_ = uVar171;
      auVar30._24_4_ = uVar171;
      auVar30._28_4_ = uVar171;
      uVar16 = vcmpps_avx512vl(auVar183,auVar30,2);
      uVar141 = (uint)uVar16 & (uint)abStack_180[lVar61];
      uVar62 = uVar70;
    } while (uVar141 == 0);
    uVar64 = (&uStack_140)[uVar69 * 0xc];
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar64;
    auVar210._8_4_ = 0x7f800000;
    auVar210._0_8_ = 0x7f8000007f800000;
    auVar210._12_4_ = 0x7f800000;
    auVar210._16_4_ = 0x7f800000;
    auVar210._20_4_ = 0x7f800000;
    auVar210._24_4_ = 0x7f800000;
    auVar210._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar210,auVar83);
    bVar56 = (byte)uVar141;
    auVar135._0_4_ =
         (uint)(bVar56 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar83._0_4_;
    bVar68 = (bool)((byte)(uVar141 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar68 * auVar84._4_4_ | (uint)!bVar68 * (int)auVar83._4_4_;
    bVar68 = (bool)((byte)(uVar141 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar68 * auVar84._8_4_ | (uint)!bVar68 * (int)auVar83._8_4_;
    bVar68 = (bool)((byte)(uVar141 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar68 * auVar84._12_4_ | (uint)!bVar68 * (int)auVar83._12_4_;
    bVar68 = (bool)((byte)(uVar141 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar68 * auVar84._16_4_ | (uint)!bVar68 * (int)auVar83._16_4_;
    bVar68 = (bool)((byte)(uVar141 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar68 * auVar84._20_4_ | (uint)!bVar68 * (int)auVar83._20_4_;
    bVar68 = (bool)((byte)(uVar141 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar68 * auVar84._24_4_ | (uint)!bVar68 * (int)auVar83._24_4_;
    auVar135._28_4_ =
         (uVar141 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar141 >> 7,0) * (int)auVar83._28_4_;
    auVar83 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar83 = vminps_avx(auVar135,auVar83);
    auVar84 = vshufpd_avx(auVar83,auVar83,5);
    auVar83 = vminps_avx(auVar83,auVar84);
    auVar84 = vpermpd_avx2(auVar83,0x4e);
    auVar83 = vminps_avx(auVar83,auVar84);
    uVar16 = vcmpps_avx512vl(auVar135,auVar83,0);
    bVar63 = (byte)uVar16 & bVar56;
    if (bVar63 != 0) {
      uVar141 = (uint)bVar63;
    }
    uVar142 = 0;
    for (; (uVar141 & 1) == 0; uVar141 = uVar141 >> 1 | 0x80000000) {
      uVar142 = uVar142 + 1;
    }
    local_b18 = aiStack_138[uVar69 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar142 & 0x1f)) & bVar56;
    abStack_180[lVar61] = bVar56;
    uVar62 = uVar71;
    if (bVar56 == 0) {
      uVar62 = uVar70;
    }
    uVar171 = (undefined4)uVar64;
    auVar159._4_4_ = uVar171;
    auVar159._0_4_ = uVar171;
    auVar159._8_4_ = uVar171;
    auVar159._12_4_ = uVar171;
    auVar159._16_4_ = uVar171;
    auVar159._20_4_ = uVar171;
    auVar159._24_4_ = uVar171;
    auVar159._28_4_ = uVar171;
    auVar74 = vmovshdup_avx(auVar172);
    auVar74 = vsubps_avx(auVar74,auVar172);
    auVar184._0_4_ = auVar74._0_4_;
    auVar184._4_4_ = auVar184._0_4_;
    auVar184._8_4_ = auVar184._0_4_;
    auVar184._12_4_ = auVar184._0_4_;
    auVar184._16_4_ = auVar184._0_4_;
    auVar184._20_4_ = auVar184._0_4_;
    auVar184._24_4_ = auVar184._0_4_;
    auVar184._28_4_ = auVar184._0_4_;
    auVar74 = vfmadd132ps_fma(auVar184,auVar159,_DAT_01faff20);
    auVar83 = ZEXT1632(auVar74);
    local_480[0] = (RTCHitN)auVar83[0];
    local_480[1] = (RTCHitN)auVar83[1];
    local_480[2] = (RTCHitN)auVar83[2];
    local_480[3] = (RTCHitN)auVar83[3];
    local_480[4] = (RTCHitN)auVar83[4];
    local_480[5] = (RTCHitN)auVar83[5];
    local_480[6] = (RTCHitN)auVar83[6];
    local_480[7] = (RTCHitN)auVar83[7];
    local_480[8] = (RTCHitN)auVar83[8];
    local_480[9] = (RTCHitN)auVar83[9];
    local_480[10] = (RTCHitN)auVar83[10];
    local_480[0xb] = (RTCHitN)auVar83[0xb];
    local_480[0xc] = (RTCHitN)auVar83[0xc];
    local_480[0xd] = (RTCHitN)auVar83[0xd];
    local_480[0xe] = (RTCHitN)auVar83[0xe];
    local_480[0xf] = (RTCHitN)auVar83[0xf];
    local_480[0x10] = (RTCHitN)auVar83[0x10];
    local_480[0x11] = (RTCHitN)auVar83[0x11];
    local_480[0x12] = (RTCHitN)auVar83[0x12];
    local_480[0x13] = (RTCHitN)auVar83[0x13];
    local_480[0x14] = (RTCHitN)auVar83[0x14];
    local_480[0x15] = (RTCHitN)auVar83[0x15];
    local_480[0x16] = (RTCHitN)auVar83[0x16];
    local_480[0x17] = (RTCHitN)auVar83[0x17];
    local_480[0x18] = (RTCHitN)auVar83[0x18];
    local_480[0x19] = (RTCHitN)auVar83[0x19];
    local_480[0x1a] = (RTCHitN)auVar83[0x1a];
    local_480[0x1b] = (RTCHitN)auVar83[0x1b];
    local_480[0x1c] = (RTCHitN)auVar83[0x1c];
    local_480[0x1d] = (RTCHitN)auVar83[0x1d];
    local_480[0x1e] = (RTCHitN)auVar83[0x1e];
    local_480[0x1f] = (RTCHitN)auVar83[0x1f];
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_480 + (ulong)uVar142 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }